

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

void embree::avx512::CurveNvIntersectorK<8,4>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint uVar11;
  int iVar12;
  undefined4 uVar13;
  RTCFilterFunctionN p_Var14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  undefined8 uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  int iVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  byte bVar68;
  ulong uVar69;
  ulong uVar70;
  uint uVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  Geometry *pGVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined8 in_R10;
  ulong uVar76;
  long lVar77;
  long lVar78;
  byte bVar79;
  ulong uVar80;
  float fVar81;
  float fVar82;
  float fVar132;
  float fVar133;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar87 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar88 [16];
  float fVar134;
  float fVar136;
  float fVar137;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar89 [16];
  float fVar135;
  float fVar138;
  float fVar139;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar140;
  undefined4 uVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar155;
  float fVar156;
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined8 uVar157;
  undefined1 auVar158 [32];
  float fVar159;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  float fVar167;
  float fVar168;
  float fVar177;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [64];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [64];
  undefined1 auVar208 [64];
  undefined1 auVar209 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  undefined1 local_5c0 [8];
  undefined8 uStack_5b8;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [16];
  RTCFilterFunctionNArguments local_590;
  undefined1 local_560 [16];
  RayHitK<4> *local_550;
  long local_548;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined4 local_4a0;
  undefined4 uStack_49c;
  undefined4 uStack_498;
  undefined4 uStack_494;
  undefined4 uStack_490;
  undefined4 uStack_48c;
  undefined4 uStack_488;
  undefined4 uStack_484;
  undefined4 local_480;
  undefined4 uStack_47c;
  undefined4 uStack_478;
  undefined4 uStack_474;
  undefined4 uStack_470;
  undefined4 uStack_46c;
  undefined4 uStack_468;
  undefined4 uStack_464;
  int local_450;
  int iStack_44c;
  int iStack_448;
  int iStack_444;
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  undefined4 local_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined1 local_3f0 [16];
  uint local_3e0;
  uint uStack_3dc;
  uint uStack_3d8;
  uint uStack_3d4;
  uint uStack_3d0;
  uint uStack_3cc;
  uint uStack_3c8;
  uint uStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined4 local_260;
  int local_25c;
  undefined1 local_250 [16];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar69 = (ulong)(byte)prim[1];
  fVar159 = *(float *)(prim + uVar69 * 0x19 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar87 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar160 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + uVar69 * 0x19 + 6));
  fVar167 = fVar159 * auVar160._0_4_;
  fVar140 = fVar159 * auVar87._0_4_;
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar69 * 4 + 6);
  auVar96 = vpmovsxbd_avx2(auVar83);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)(prim + uVar69 * 5 + 6);
  auVar94 = vpmovsxbd_avx2(auVar86);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar85._8_8_ = 0;
  auVar85._0_8_ = *(ulong *)(prim + uVar69 * 6 + 6);
  auVar95 = vpmovsxbd_avx2(auVar85);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar69 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar84);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar69 * 0xc + 6);
  auVar98 = vpmovsxbd_avx2(auVar6);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar69 * 0xd + 6);
  auVar97 = vpmovsxbd_avx2(auVar7);
  auVar97 = vcvtdq2ps_avx(auVar97);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar69 * 0x12 + 6);
  auVar104 = vpmovsxbd_avx2(auVar8);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar69 * 0x13 + 6);
  auVar103 = vpmovsxbd_avx2(auVar9);
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar69 * 0x14 + 6);
  auVar100 = vpmovsxbd_avx2(auVar10);
  auVar99 = vcvtdq2ps_avx(auVar100);
  auVar201._4_4_ = fVar140;
  auVar201._0_4_ = fVar140;
  auVar201._8_4_ = fVar140;
  auVar201._12_4_ = fVar140;
  auVar201._16_4_ = fVar140;
  auVar201._20_4_ = fVar140;
  auVar201._24_4_ = fVar140;
  auVar201._28_4_ = fVar140;
  auVar203._8_4_ = 1;
  auVar203._0_8_ = 0x100000001;
  auVar203._12_4_ = 1;
  auVar203._16_4_ = 1;
  auVar203._20_4_ = 1;
  auVar203._24_4_ = 1;
  auVar203._28_4_ = 1;
  auVar93 = ZEXT1632(CONCAT412(fVar159 * auVar87._12_4_,
                               CONCAT48(fVar159 * auVar87._8_4_,
                                        CONCAT44(fVar159 * auVar87._4_4_,fVar140))));
  auVar92 = vpermps_avx2(auVar203,auVar93);
  auVar90 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar90);
  auVar91 = vpermps_avx512vl(auVar90,auVar93);
  fVar140 = auVar91._0_4_;
  auVar208._0_4_ = fVar140 * auVar95._0_4_;
  fVar155 = auVar91._4_4_;
  auVar208._4_4_ = fVar155 * auVar95._4_4_;
  fVar156 = auVar91._8_4_;
  auVar208._8_4_ = fVar156 * auVar95._8_4_;
  fVar168 = auVar91._12_4_;
  auVar208._12_4_ = fVar168 * auVar95._12_4_;
  fVar177 = auVar91._16_4_;
  auVar208._16_4_ = fVar177 * auVar95._16_4_;
  fVar81 = auVar91._20_4_;
  auVar208._20_4_ = fVar81 * auVar95._20_4_;
  fVar82 = auVar91._24_4_;
  auVar208._28_36_ = in_ZMM4._28_36_;
  auVar208._24_4_ = fVar82 * auVar95._24_4_;
  auVar93._4_4_ = auVar97._4_4_ * fVar155;
  auVar93._0_4_ = auVar97._0_4_ * fVar140;
  auVar93._8_4_ = auVar97._8_4_ * fVar156;
  auVar93._12_4_ = auVar97._12_4_ * fVar168;
  auVar93._16_4_ = auVar97._16_4_ * fVar177;
  auVar93._20_4_ = auVar97._20_4_ * fVar81;
  auVar93._24_4_ = auVar97._24_4_ * fVar82;
  auVar93._28_4_ = auVar100._28_4_;
  auVar100._4_4_ = auVar99._4_4_ * fVar155;
  auVar100._0_4_ = auVar99._0_4_ * fVar140;
  auVar100._8_4_ = auVar99._8_4_ * fVar156;
  auVar100._12_4_ = auVar99._12_4_ * fVar168;
  auVar100._16_4_ = auVar99._16_4_ * fVar177;
  auVar100._20_4_ = auVar99._20_4_ * fVar81;
  auVar100._24_4_ = auVar99._24_4_ * fVar82;
  auVar100._28_4_ = auVar91._28_4_;
  auVar83 = vfmadd231ps_fma(auVar208._0_32_,auVar92,auVar94);
  auVar86 = vfmadd231ps_fma(auVar93,auVar92,auVar98);
  auVar85 = vfmadd231ps_fma(auVar100,auVar103,auVar92);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar201,auVar96);
  auVar86 = vfmadd231ps_fma(ZEXT1632(auVar86),auVar201,auVar105);
  auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,auVar201);
  auVar202._4_4_ = fVar167;
  auVar202._0_4_ = fVar167;
  auVar202._8_4_ = fVar167;
  auVar202._12_4_ = fVar167;
  auVar202._16_4_ = fVar167;
  auVar202._20_4_ = fVar167;
  auVar202._24_4_ = fVar167;
  auVar202._28_4_ = fVar167;
  auVar92 = ZEXT1632(CONCAT412(fVar159 * auVar160._12_4_,
                               CONCAT48(fVar159 * auVar160._8_4_,
                                        CONCAT44(fVar159 * auVar160._4_4_,fVar167))));
  auVar100 = vpermps_avx2(auVar203,auVar92);
  auVar92 = vpermps_avx512vl(auVar90,auVar92);
  auVar93 = vmulps_avx512vl(auVar92,auVar95);
  auVar102._0_4_ = auVar92._0_4_ * auVar97._0_4_;
  auVar102._4_4_ = auVar92._4_4_ * auVar97._4_4_;
  auVar102._8_4_ = auVar92._8_4_ * auVar97._8_4_;
  auVar102._12_4_ = auVar92._12_4_ * auVar97._12_4_;
  auVar102._16_4_ = auVar92._16_4_ * auVar97._16_4_;
  auVar102._20_4_ = auVar92._20_4_ * auVar97._20_4_;
  auVar102._24_4_ = auVar92._24_4_ * auVar97._24_4_;
  auVar102._28_4_ = 0;
  auVar97._4_4_ = auVar92._4_4_ * auVar99._4_4_;
  auVar97._0_4_ = auVar92._0_4_ * auVar99._0_4_;
  auVar97._8_4_ = auVar92._8_4_ * auVar99._8_4_;
  auVar97._12_4_ = auVar92._12_4_ * auVar99._12_4_;
  auVar97._16_4_ = auVar92._16_4_ * auVar99._16_4_;
  auVar97._20_4_ = auVar92._20_4_ * auVar99._20_4_;
  auVar97._24_4_ = auVar92._24_4_ * auVar99._24_4_;
  auVar97._28_4_ = auVar95._28_4_;
  auVar94 = vfmadd231ps_avx512vl(auVar93,auVar100,auVar94);
  auVar84 = vfmadd231ps_fma(auVar102,auVar100,auVar98);
  auVar6 = vfmadd231ps_fma(auVar97,auVar100,auVar103);
  auVar94 = vfmadd231ps_avx512vl(auVar94,auVar202,auVar96);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar202,auVar105);
  auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar202,auVar104);
  auVar190._8_4_ = 0x7fffffff;
  auVar190._0_8_ = 0x7fffffff7fffffff;
  auVar190._12_4_ = 0x7fffffff;
  auVar190._16_4_ = 0x7fffffff;
  auVar190._20_4_ = 0x7fffffff;
  auVar190._24_4_ = 0x7fffffff;
  auVar190._28_4_ = 0x7fffffff;
  auVar96 = vandps_avx(ZEXT1632(auVar83),auVar190);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  uVar76 = vcmpps_avx512vl(auVar96,auVar188,1);
  bVar15 = (bool)((byte)uVar76 & 1);
  auVar92._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._0_4_;
  bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._4_4_;
  bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._8_4_;
  bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar83._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar86),auVar190);
  uVar76 = vcmpps_avx512vl(auVar96,auVar188,1);
  bVar15 = (bool)((byte)uVar76 & 1);
  auVar90._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._0_4_;
  bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._4_4_;
  bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._8_4_;
  bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar86._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar96 = vandps_avx(ZEXT1632(auVar85),auVar190);
  uVar76 = vcmpps_avx512vl(auVar96,auVar188,1);
  bVar15 = (bool)((byte)uVar76 & 1);
  auVar96._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._0_4_;
  bVar15 = (bool)((byte)(uVar76 >> 1) & 1);
  auVar96._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._4_4_;
  bVar15 = (bool)((byte)(uVar76 >> 2) & 1);
  auVar96._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._8_4_;
  bVar15 = (bool)((byte)(uVar76 >> 3) & 1);
  auVar96._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar85._12_4_;
  auVar96._16_4_ = (uint)((byte)(uVar76 >> 4) & 1) * 0x219392ef;
  auVar96._20_4_ = (uint)((byte)(uVar76 >> 5) & 1) * 0x219392ef;
  auVar96._24_4_ = (uint)((byte)(uVar76 >> 6) & 1) * 0x219392ef;
  auVar96._28_4_ = (uint)(byte)(uVar76 >> 7) * 0x219392ef;
  auVar95 = vrcp14ps_avx512vl(auVar92);
  auVar189._8_4_ = 0x3f800000;
  auVar189._0_8_ = 0x3f8000003f800000;
  auVar189._12_4_ = 0x3f800000;
  auVar189._16_4_ = 0x3f800000;
  auVar189._20_4_ = 0x3f800000;
  auVar189._24_4_ = 0x3f800000;
  auVar189._28_4_ = 0x3f800000;
  auVar83 = vfnmadd213ps_fma(auVar92,auVar95,auVar189);
  auVar83 = vfmadd132ps_fma(ZEXT1632(auVar83),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar90);
  auVar86 = vfnmadd213ps_fma(auVar90,auVar95,auVar189);
  auVar86 = vfmadd132ps_fma(ZEXT1632(auVar86),auVar95,auVar95);
  auVar95 = vrcp14ps_avx512vl(auVar96);
  auVar85 = vfnmadd213ps_fma(auVar96,auVar95,auVar189);
  auVar85 = vfmadd132ps_fma(ZEXT1632(auVar85),auVar95,auVar95);
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 7 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx512vl(auVar96,auVar94);
  auVar104._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar104._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar104._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar104._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar104._16_4_ = auVar96._16_4_ * 0.0;
  auVar104._20_4_ = auVar96._20_4_ * 0.0;
  auVar104._24_4_ = auVar96._24_4_ * 0.0;
  auVar104._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 9 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx512vl(auVar96,auVar94);
  auVar106._0_4_ = auVar83._0_4_ * auVar96._0_4_;
  auVar106._4_4_ = auVar83._4_4_ * auVar96._4_4_;
  auVar106._8_4_ = auVar83._8_4_ * auVar96._8_4_;
  auVar106._12_4_ = auVar83._12_4_ * auVar96._12_4_;
  auVar106._16_4_ = auVar96._16_4_ * 0.0;
  auVar106._20_4_ = auVar96._20_4_ * 0.0;
  auVar106._24_4_ = auVar96._24_4_ * 0.0;
  auVar106._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0xe + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar97 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar103._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar103._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar103._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar103._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar103._16_4_ = auVar96._16_4_ * 0.0;
  auVar103._20_4_ = auVar96._20_4_ * 0.0;
  auVar103._24_4_ = auVar96._24_4_ * 0.0;
  auVar103._28_4_ = auVar96._28_4_;
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar84));
  auVar101._0_4_ = auVar86._0_4_ * auVar96._0_4_;
  auVar101._4_4_ = auVar86._4_4_ * auVar96._4_4_;
  auVar101._8_4_ = auVar86._8_4_ * auVar96._8_4_;
  auVar101._12_4_ = auVar86._12_4_ * auVar96._12_4_;
  auVar101._16_4_ = auVar96._16_4_ * 0.0;
  auVar101._20_4_ = auVar96._20_4_ * 0.0;
  auVar101._24_4_ = auVar96._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x15 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar6));
  auVar99._4_4_ = auVar96._4_4_ * auVar85._4_4_;
  auVar99._0_4_ = auVar96._0_4_ * auVar85._0_4_;
  auVar99._8_4_ = auVar96._8_4_ * auVar85._8_4_;
  auVar99._12_4_ = auVar96._12_4_ * auVar85._12_4_;
  auVar99._16_4_ = auVar96._16_4_ * 0.0;
  auVar99._20_4_ = auVar96._20_4_ * 0.0;
  auVar99._24_4_ = auVar96._24_4_ * 0.0;
  auVar99._28_4_ = auVar96._28_4_;
  auVar96 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar69 * 0x17 + 6));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,ZEXT1632(auVar6));
  auVar91._0_4_ = auVar85._0_4_ * auVar96._0_4_;
  auVar91._4_4_ = auVar85._4_4_ * auVar96._4_4_;
  auVar91._8_4_ = auVar85._8_4_ * auVar96._8_4_;
  auVar91._12_4_ = auVar85._12_4_ * auVar96._12_4_;
  auVar91._16_4_ = auVar96._16_4_ * 0.0;
  auVar91._20_4_ = auVar96._20_4_ * 0.0;
  auVar91._24_4_ = auVar96._24_4_ * 0.0;
  auVar91._28_4_ = 0;
  auVar96 = vpminsd_avx2(auVar104,auVar106);
  auVar94 = vpminsd_avx2(auVar103,auVar101);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx2(auVar99,auVar91);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar95._4_4_ = uVar3;
  auVar95._0_4_ = uVar3;
  auVar95._8_4_ = uVar3;
  auVar95._12_4_ = uVar3;
  auVar95._16_4_ = uVar3;
  auVar95._20_4_ = uVar3;
  auVar95._24_4_ = uVar3;
  auVar95._28_4_ = uVar3;
  auVar94 = vmaxps_avx512vl(auVar94,auVar95);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94._8_4_ = 0x3f7ffffa;
  auVar94._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar94._12_4_ = 0x3f7ffffa;
  auVar94._16_4_ = 0x3f7ffffa;
  auVar94._20_4_ = 0x3f7ffffa;
  auVar94._24_4_ = 0x3f7ffffa;
  auVar94._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar96,auVar94);
  auVar96 = vpmaxsd_avx2(auVar104,auVar106);
  auVar94 = vpmaxsd_avx2(auVar103,auVar101);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx2(auVar99,auVar91);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar105._4_4_ = uVar3;
  auVar105._0_4_ = uVar3;
  auVar105._8_4_ = uVar3;
  auVar105._12_4_ = uVar3;
  auVar105._16_4_ = uVar3;
  auVar105._20_4_ = uVar3;
  auVar105._24_4_ = uVar3;
  auVar105._28_4_ = uVar3;
  auVar94 = vminps_avx512vl(auVar94,auVar105);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar98._8_4_ = 0x3f800003;
  auVar98._0_8_ = 0x3f8000033f800003;
  auVar98._12_4_ = 0x3f800003;
  auVar98._16_4_ = 0x3f800003;
  auVar98._20_4_ = 0x3f800003;
  auVar98._24_4_ = 0x3f800003;
  auVar98._28_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar98);
  uVar157 = vcmpps_avx512vl(local_80,auVar96,2);
  uVar21 = vpcmpgtd_avx512vl(auVar97,_DAT_01fb4ba0);
  uVar76 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar157 & (byte)uVar21));
  local_4d0 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar208 = ZEXT1664(auVar83);
  auVar209 = ZEXT464(0x35000000);
  local_550 = ray;
  do {
    if (uVar76 == 0) {
      return;
    }
    lVar74 = 0;
    for (uVar70 = uVar76; (uVar70 & 1) == 0; uVar70 = uVar70 >> 1 | 0x8000000000000000) {
      lVar74 = lVar74 + 1;
    }
    uVar76 = uVar76 - 1 & uVar76;
    uVar3 = *(undefined4 *)(prim + lVar74 * 4 + 6);
    uVar70 = (ulong)(uint)((int)lVar74 << 6);
    uVar11 = *(uint *)(prim + 2);
    pGVar75 = (context->scene->geometries).items[uVar11].ptr;
    local_5d0 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x16);
    if (uVar76 != 0) {
      uVar73 = uVar76 - 1 & uVar76;
      for (uVar80 = uVar76; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x8000000000000000) {
      }
      if (uVar73 != 0) {
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_5a0 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x26);
    local_5b0 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x36);
    _local_5c0 = *(undefined1 (*) [16])(prim + uVar70 + uVar69 * 0x19 + 0x46);
    iVar12 = (int)pGVar75[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar85 = vsubps_avx(local_5d0,auVar83);
    uVar141 = auVar85._0_4_;
    auVar87._4_4_ = uVar141;
    auVar87._0_4_ = uVar141;
    auVar87._8_4_ = uVar141;
    auVar87._12_4_ = uVar141;
    auVar86 = vshufps_avx(auVar85,auVar85,0x55);
    aVar4 = pre->ray_space[k].vx.field_0;
    aVar5 = pre->ray_space[k].vy.field_0;
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    fVar159 = pre->ray_space[k].vz.field_0.m128[0];
    fVar140 = pre->ray_space[k].vz.field_0.m128[1];
    fVar155 = pre->ray_space[k].vz.field_0.m128[2];
    fVar156 = pre->ray_space[k].vz.field_0.m128[3];
    auVar89._0_4_ = fVar159 * auVar85._0_4_;
    auVar89._4_4_ = fVar140 * auVar85._4_4_;
    auVar89._8_4_ = fVar155 * auVar85._8_4_;
    auVar89._12_4_ = fVar156 * auVar85._12_4_;
    auVar86 = vfmadd231ps_fma(auVar89,(undefined1  [16])aVar5,auVar86);
    auVar6 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar4,auVar87);
    auVar86 = vshufps_avx(local_5d0,local_5d0,0xff);
    auVar84 = vsubps_avx(local_5a0,auVar83);
    uVar141 = auVar84._0_4_;
    auVar169._4_4_ = uVar141;
    auVar169._0_4_ = uVar141;
    auVar169._8_4_ = uVar141;
    auVar169._12_4_ = uVar141;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar194._0_4_ = fVar159 * auVar84._0_4_;
    auVar194._4_4_ = fVar140 * auVar84._4_4_;
    auVar194._8_4_ = fVar155 * auVar84._8_4_;
    auVar194._12_4_ = fVar156 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar5,auVar85);
    auVar7 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar169);
    auVar84 = vsubps_avx512vl(local_5b0,auVar83);
    uVar141 = auVar84._0_4_;
    auVar88._4_4_ = uVar141;
    auVar88._0_4_ = uVar141;
    auVar88._8_4_ = uVar141;
    auVar88._12_4_ = uVar141;
    auVar85 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar197._0_4_ = fVar159 * auVar84._0_4_;
    auVar197._4_4_ = fVar140 * auVar84._4_4_;
    auVar197._8_4_ = fVar155 * auVar84._8_4_;
    auVar197._12_4_ = fVar156 * auVar84._12_4_;
    auVar85 = vfmadd231ps_fma(auVar197,(undefined1  [16])aVar5,auVar85);
    auVar84 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar88);
    auVar85 = vsubps_avx512vl(_local_5c0,auVar83);
    uVar141 = auVar85._0_4_;
    auVar160._4_4_ = uVar141;
    auVar160._0_4_ = uVar141;
    auVar160._8_4_ = uVar141;
    auVar160._12_4_ = uVar141;
    auVar83 = vshufps_avx(auVar85,auVar85,0x55);
    auVar85 = vshufps_avx(auVar85,auVar85,0xaa);
    auVar200._0_4_ = fVar159 * auVar85._0_4_;
    auVar200._4_4_ = fVar140 * auVar85._4_4_;
    auVar200._8_4_ = fVar155 * auVar85._8_4_;
    auVar200._12_4_ = fVar156 * auVar85._12_4_;
    auVar83 = vfmadd231ps_fma(auVar200,(undefined1  [16])aVar5,auVar83);
    auVar85 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar4,auVar160);
    lVar74 = (long)iVar12;
    lVar78 = lVar74 * 0x44;
    auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar78);
    uVar141 = auVar6._0_4_;
    local_2e0._4_4_ = uVar141;
    local_2e0._0_4_ = uVar141;
    local_2e0._8_4_ = uVar141;
    local_2e0._12_4_ = uVar141;
    local_2e0._16_4_ = uVar141;
    local_2e0._20_4_ = uVar141;
    local_2e0._24_4_ = uVar141;
    local_2e0._28_4_ = uVar141;
    auVar146._8_4_ = 1;
    auVar146._0_8_ = 0x100000001;
    auVar146._12_4_ = 1;
    auVar146._16_4_ = 1;
    auVar146._20_4_ = 1;
    auVar146._24_4_ = 1;
    auVar146._28_4_ = 1;
    local_300 = vpermps_avx2(auVar146,ZEXT1632(auVar6));
    auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x484);
    local_320 = vbroadcastss_avx512vl(auVar7);
    local_340 = vpermps_avx512vl(auVar146,ZEXT1632(auVar7));
    auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x908);
    local_360 = vbroadcastss_avx512vl(auVar84);
    local_380 = vpermps_avx512vl(auVar146,ZEXT1632(auVar84));
    auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0xd8c);
    fVar159 = auVar85._0_4_;
    local_3a0._4_4_ = fVar159;
    local_3a0._0_4_ = fVar159;
    fStack_398 = fVar159;
    fStack_394 = fVar159;
    fStack_390 = fVar159;
    fStack_38c = fVar159;
    fStack_388 = fVar159;
    register0x0000139c = fVar159;
    _local_3c0 = vpermps_avx512vl(auVar146,ZEXT1632(auVar85));
    auVar98 = vmulps_avx512vl(_local_3a0,auVar105);
    auVar97 = vmulps_avx512vl(_local_3c0,auVar105);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_360);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar95,local_380);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_320);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_340);
    auVar99 = vfmadd231ps_avx512vl(auVar98,auVar96,local_2e0);
    auVar187 = ZEXT3264(auVar99);
    auVar100 = vfmadd231ps_avx512vl(auVar97,auVar96,local_300);
    auVar182 = ZEXT3264(auVar100);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar78);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x484);
    auVar104 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x908);
    auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0xd8c);
    auVar92 = vmulps_avx512vl(_local_3a0,auVar103);
    auVar93 = vmulps_avx512vl(_local_3c0,auVar103);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar104,local_360);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar104,local_380);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar97,local_320);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_340);
    auVar8 = vfmadd231ps_fma(auVar92,auVar98,local_2e0);
    auVar191 = ZEXT1664(auVar8);
    auVar9 = vfmadd231ps_fma(auVar93,auVar98,local_300);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar8),auVar99);
    auVar93 = vsubps_avx512vl(ZEXT1632(auVar9),auVar100);
    auVar90 = vmulps_avx512vl(auVar100,auVar92);
    auVar91 = vmulps_avx512vl(auVar99,auVar93);
    auVar90 = vsubps_avx512vl(auVar90,auVar91);
    auVar83 = vshufps_avx(local_5a0,local_5a0,0xff);
    uVar157 = auVar86._0_8_;
    local_a0._8_8_ = uVar157;
    local_a0._0_8_ = uVar157;
    local_a0._16_8_ = uVar157;
    local_a0._24_8_ = uVar157;
    local_c0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(local_5b0,local_5b0,0xff);
    local_e0 = vbroadcastsd_avx512vl(auVar83);
    auVar83 = vshufps_avx512vl(_local_5c0,_local_5c0,0xff);
    uVar157 = auVar83._0_8_;
    local_100._8_8_ = uVar157;
    local_100._0_8_ = uVar157;
    local_100._16_8_ = uVar157;
    local_100._24_8_ = uVar157;
    auVar91 = vmulps_avx512vl(local_100,auVar105);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar95,local_e0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar94,local_c0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar96,local_a0);
    auVar101 = vmulps_avx512vl(local_100,auVar103);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar104,local_e0);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,local_c0);
    auVar10 = vfmadd231ps_fma(auVar101,auVar98,local_a0);
    auVar101 = vmulps_avx512vl(auVar93,auVar93);
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar92);
    auVar102 = vmaxps_avx512vl(auVar91,ZEXT1632(auVar10));
    auVar102 = vmulps_avx512vl(auVar102,auVar102);
    auVar101 = vmulps_avx512vl(auVar102,auVar101);
    auVar90 = vmulps_avx512vl(auVar90,auVar90);
    uVar157 = vcmpps_avx512vl(auVar90,auVar101,2);
    auVar83 = vblendps_avx(auVar6,local_5d0,8);
    auVar160 = auVar208._0_16_;
    auVar86 = vandps_avx512vl(auVar83,auVar160);
    auVar83 = vblendps_avx(auVar7,local_5a0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar160);
    auVar86 = vmaxps_avx(auVar86,auVar83);
    auVar83 = vblendps_avx(auVar84,local_5b0,8);
    auVar87 = vandps_avx512vl(auVar83,auVar160);
    auVar83 = vblendps_avx(auVar85,_local_5c0,8);
    auVar83 = vandps_avx512vl(auVar83,auVar160);
    auVar83 = vmaxps_avx(auVar87,auVar83);
    auVar83 = vmaxps_avx(auVar86,auVar83);
    auVar86 = vmovshdup_avx(auVar83);
    auVar86 = vmaxss_avx(auVar86,auVar83);
    auVar83 = vshufpd_avx(auVar83,auVar83,1);
    auVar83 = vmaxss_avx(auVar83,auVar86);
    auVar86 = vcvtsi2ss_avx512f(_local_5c0,iVar12);
    local_500._0_16_ = auVar86;
    auVar198._0_4_ = auVar86._0_4_;
    auVar198._4_4_ = auVar198._0_4_;
    auVar198._8_4_ = auVar198._0_4_;
    auVar198._12_4_ = auVar198._0_4_;
    auVar198._16_4_ = auVar198._0_4_;
    auVar198._20_4_ = auVar198._0_4_;
    auVar198._24_4_ = auVar198._0_4_;
    auVar198._28_4_ = auVar198._0_4_;
    uVar21 = vcmpps_avx512vl(auVar198,_DAT_01f7b060,0xe);
    bVar79 = (byte)uVar157 & (byte)uVar21;
    local_560 = vmulss_avx512f(auVar83,auVar209._0_16_);
    auVar101 = auVar207._0_32_;
    auVar90 = vpermps_avx512vl(auVar101,ZEXT1632(auVar6));
    local_160 = vpermps_avx512vl(auVar101,ZEXT1632(auVar7));
    local_180 = vpermps_avx512vl(auVar101,ZEXT1632(auVar84));
    local_1a0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar85));
    local_480 = *(undefined4 *)(ray + k * 4 + 0x30);
    uStack_47c = 0;
    uStack_478 = 0;
    uStack_474 = 0;
    local_4b0 = vpbroadcastd_avx512vl();
    local_4c0 = vpbroadcastd_avx512vl();
    if (bVar79 != 0) {
      auVar103 = vmulps_avx512vl(local_1a0,auVar103);
      auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar103);
      auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar104);
      auVar97 = vfmadd213ps_avx512vl(auVar98,auVar90,auVar97);
      auVar105 = vmulps_avx512vl(local_1a0,auVar105);
      auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar105);
      auVar104 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1694);
      auVar105 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1b18);
      auVar98 = *(undefined1 (*) [32])(bezier_basis0 + lVar78 + 0x1f9c);
      auVar104 = vfmadd213ps_avx512vl(auVar96,auVar90,auVar104);
      auVar195._0_4_ = fVar159 * auVar98._0_4_;
      auVar195._4_4_ = fVar159 * auVar98._4_4_;
      auVar195._8_4_ = fVar159 * auVar98._8_4_;
      auVar195._12_4_ = fVar159 * auVar98._12_4_;
      auVar195._16_4_ = fVar159 * auVar98._16_4_;
      auVar195._20_4_ = fVar159 * auVar98._20_4_;
      auVar195._24_4_ = fVar159 * auVar98._24_4_;
      auVar195._28_4_ = 0;
      auVar96 = vmulps_avx512vl(_local_3c0,auVar98);
      auVar98 = vmulps_avx512vl(local_1a0,auVar98);
      auVar103 = vfmadd231ps_avx512vl(auVar195,auVar105,local_360);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar105,local_380);
      auVar105 = vfmadd231ps_avx512vl(auVar98,local_180,auVar105);
      auVar98 = vfmadd231ps_avx512vl(auVar103,auVar95,local_320);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar95,local_340);
      auVar103 = vfmadd231ps_avx512vl(auVar105,local_160,auVar95);
      auVar83 = vfmadd231ps_fma(auVar98,auVar94,local_2e0);
      auVar98 = vfmadd231ps_avx512vl(auVar96,auVar94,local_300);
      auVar96 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1210);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1b18);
      auVar105 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1f9c);
      auVar103 = vfmadd231ps_avx512vl(auVar103,auVar90,auVar94);
      auVar31._4_4_ = fVar159 * auVar105._4_4_;
      auVar31._0_4_ = fVar159 * auVar105._0_4_;
      auVar31._8_4_ = fVar159 * auVar105._8_4_;
      auVar31._12_4_ = fVar159 * auVar105._12_4_;
      auVar31._16_4_ = fVar159 * auVar105._16_4_;
      auVar31._20_4_ = fVar159 * auVar105._20_4_;
      auVar31._24_4_ = fVar159 * auVar105._24_4_;
      auVar31._28_4_ = auVar94._28_4_;
      auVar94 = vmulps_avx512vl(_local_3c0,auVar105);
      auVar105 = vmulps_avx512vl(local_1a0,auVar105);
      auVar102 = vfmadd231ps_avx512vl(auVar31,auVar95,local_360);
      auVar106 = vfmadd231ps_avx512vl(auVar94,auVar95,local_380);
      auVar206 = ZEXT3264(auVar90);
      auVar95 = vfmadd231ps_avx512vl(auVar105,local_180,auVar95);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar78 + 0x1694);
      auVar105 = vfmadd231ps_avx512vl(auVar102,auVar94,local_320);
      auVar102 = vfmadd231ps_avx512vl(auVar106,auVar94,local_340);
      auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
      auVar209 = ZEXT1664(auVar209._0_16_);
      auVar207 = ZEXT3264(auVar101);
      auVar208 = ZEXT1664(auVar160);
      auVar86 = vfmadd231ps_fma(auVar105,auVar96,local_2e0);
      auVar95 = vfmadd231ps_avx512vl(auVar102,auVar96,local_300);
      auVar105 = vfmadd231ps_avx512vl(auVar94,auVar90,auVar96);
      auVar204._8_4_ = 0x7fffffff;
      auVar204._0_8_ = 0x7fffffff7fffffff;
      auVar204._12_4_ = 0x7fffffff;
      auVar204._16_4_ = 0x7fffffff;
      auVar204._20_4_ = 0x7fffffff;
      auVar204._24_4_ = 0x7fffffff;
      auVar204._28_4_ = 0x7fffffff;
      auVar96 = vandps_avx(ZEXT1632(auVar83),auVar204);
      auVar94 = vandps_avx(auVar98,auVar204);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar96 = vandps_avx(auVar103,auVar204);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      auVar199._4_4_ = local_560._0_4_;
      auVar199._0_4_ = local_560._0_4_;
      auVar199._8_4_ = local_560._0_4_;
      auVar199._12_4_ = local_560._0_4_;
      auVar199._16_4_ = local_560._0_4_;
      auVar199._20_4_ = local_560._0_4_;
      auVar199._24_4_ = local_560._0_4_;
      auVar199._28_4_ = local_560._0_4_;
      uVar70 = vcmpps_avx512vl(auVar96,auVar199,1);
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar107._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar83._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar107._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar83._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar107._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar83._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar107._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar83._12_4_);
      fVar159 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
      auVar107._16_4_ = fVar159;
      fVar140 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
      auVar107._20_4_ = fVar140;
      fVar155 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
      auVar107._24_4_ = fVar155;
      uVar71 = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
      auVar107._28_4_ = uVar71;
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar108._0_4_ = (float)((uint)bVar15 * auVar93._0_4_ | (uint)!bVar15 * auVar98._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar98._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar98._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar98._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar108._16_4_ = (float)((uint)bVar15 * auVar93._16_4_ | (uint)!bVar15 * auVar98._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar108._20_4_ = (float)((uint)bVar15 * auVar93._20_4_ | (uint)!bVar15 * auVar98._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar108._24_4_ = (float)((uint)bVar15 * auVar93._24_4_ | (uint)!bVar15 * auVar98._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar108._28_4_ = (uint)bVar15 * auVar93._28_4_ | (uint)!bVar15 * auVar98._28_4_;
      auVar96 = vandps_avx(auVar204,ZEXT1632(auVar86));
      auVar94 = vandps_avx(auVar95,auVar204);
      auVar94 = vmaxps_avx(auVar96,auVar94);
      auVar96 = vandps_avx(auVar105,auVar204);
      auVar96 = vmaxps_avx(auVar94,auVar96);
      uVar70 = vcmpps_avx512vl(auVar96,auVar199,1);
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar109._0_4_ = (float)((uint)bVar15 * auVar92._0_4_ | (uint)!bVar15 * auVar86._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar15 * auVar92._4_4_ | (uint)!bVar15 * auVar86._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar15 * auVar92._8_4_ | (uint)!bVar15 * auVar86._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar15 * auVar92._12_4_ | (uint)!bVar15 * auVar86._12_4_);
      fVar177 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar92._16_4_);
      auVar109._16_4_ = fVar177;
      fVar156 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar92._20_4_);
      auVar109._20_4_ = fVar156;
      fVar168 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar92._24_4_);
      auVar109._24_4_ = fVar168;
      auVar109._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar92._28_4_;
      bVar15 = (bool)((byte)uVar70 & 1);
      auVar110._0_4_ = (float)((uint)bVar15 * auVar93._0_4_ | (uint)!bVar15 * auVar95._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar110._4_4_ = (float)((uint)bVar15 * auVar93._4_4_ | (uint)!bVar15 * auVar95._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar110._8_4_ = (float)((uint)bVar15 * auVar93._8_4_ | (uint)!bVar15 * auVar95._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar110._12_4_ = (float)((uint)bVar15 * auVar93._12_4_ | (uint)!bVar15 * auVar95._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar110._16_4_ = (float)((uint)bVar15 * auVar93._16_4_ | (uint)!bVar15 * auVar95._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar110._20_4_ = (float)((uint)bVar15 * auVar93._20_4_ | (uint)!bVar15 * auVar95._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar110._24_4_ = (float)((uint)bVar15 * auVar93._24_4_ | (uint)!bVar15 * auVar95._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar110._28_4_ = (uint)bVar15 * auVar93._28_4_ | (uint)!bVar15 * auVar95._28_4_;
      auVar88 = vxorps_avx512vl(local_320._0_16_,local_320._0_16_);
      auVar96 = vfmadd213ps_avx512vl(auVar107,auVar107,ZEXT1632(auVar88));
      auVar83 = vfmadd231ps_fma(auVar96,auVar108,auVar108);
      auVar96 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar81 = auVar96._0_4_;
      fVar82 = auVar96._4_4_;
      fVar167 = auVar96._8_4_;
      fVar132 = auVar96._12_4_;
      fVar133 = auVar96._16_4_;
      fVar134 = auVar96._20_4_;
      fVar136 = auVar96._24_4_;
      auVar32._4_4_ = fVar82 * fVar82 * fVar82 * auVar83._4_4_ * -0.5;
      auVar32._0_4_ = fVar81 * fVar81 * fVar81 * auVar83._0_4_ * -0.5;
      auVar32._8_4_ = fVar167 * fVar167 * fVar167 * auVar83._8_4_ * -0.5;
      auVar32._12_4_ = fVar132 * fVar132 * fVar132 * auVar83._12_4_ * -0.5;
      auVar32._16_4_ = fVar133 * fVar133 * fVar133 * -0.0;
      auVar32._20_4_ = fVar134 * fVar134 * fVar134 * -0.0;
      auVar32._24_4_ = fVar136 * fVar136 * fVar136 * -0.0;
      auVar32._28_4_ = 0;
      auVar94 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar95 = vfmadd231ps_avx512vl(auVar32,auVar94,auVar96);
      auVar33._4_4_ = auVar108._4_4_ * auVar95._4_4_;
      auVar33._0_4_ = auVar108._0_4_ * auVar95._0_4_;
      auVar33._8_4_ = auVar108._8_4_ * auVar95._8_4_;
      auVar33._12_4_ = auVar108._12_4_ * auVar95._12_4_;
      auVar33._16_4_ = auVar108._16_4_ * auVar95._16_4_;
      auVar33._20_4_ = auVar108._20_4_ * auVar95._20_4_;
      auVar33._24_4_ = auVar108._24_4_ * auVar95._24_4_;
      auVar33._28_4_ = auVar96._28_4_;
      auVar34._4_4_ = auVar95._4_4_ * -auVar107._4_4_;
      auVar34._0_4_ = auVar95._0_4_ * -auVar107._0_4_;
      auVar34._8_4_ = auVar95._8_4_ * -auVar107._8_4_;
      auVar34._12_4_ = auVar95._12_4_ * -auVar107._12_4_;
      auVar34._16_4_ = auVar95._16_4_ * -fVar159;
      auVar34._20_4_ = auVar95._20_4_ * -fVar140;
      auVar34._24_4_ = auVar95._24_4_ * -fVar155;
      auVar34._28_4_ = uVar71 ^ 0x80000000;
      auVar96 = vmulps_avx512vl(auVar95,ZEXT1632(auVar88));
      auVar92 = ZEXT1632(auVar88);
      auVar105 = vfmadd213ps_avx512vl(auVar109,auVar109,auVar92);
      auVar83 = vfmadd231ps_fma(auVar105,auVar110,auVar110);
      auVar105 = vrsqrt14ps_avx512vl(ZEXT1632(auVar83));
      fVar159 = auVar105._0_4_;
      fVar140 = auVar105._4_4_;
      fVar155 = auVar105._8_4_;
      fVar81 = auVar105._12_4_;
      fVar82 = auVar105._16_4_;
      fVar167 = auVar105._20_4_;
      fVar132 = auVar105._24_4_;
      auVar35._4_4_ = fVar140 * fVar140 * fVar140 * auVar83._4_4_ * -0.5;
      auVar35._0_4_ = fVar159 * fVar159 * fVar159 * auVar83._0_4_ * -0.5;
      auVar35._8_4_ = fVar155 * fVar155 * fVar155 * auVar83._8_4_ * -0.5;
      auVar35._12_4_ = fVar81 * fVar81 * fVar81 * auVar83._12_4_ * -0.5;
      auVar35._16_4_ = fVar82 * fVar82 * fVar82 * -0.0;
      auVar35._20_4_ = fVar167 * fVar167 * fVar167 * -0.0;
      auVar35._24_4_ = fVar132 * fVar132 * fVar132 * -0.0;
      auVar35._28_4_ = 0;
      auVar94 = vfmadd231ps_avx512vl(auVar35,auVar94,auVar105);
      auVar36._4_4_ = auVar110._4_4_ * auVar94._4_4_;
      auVar36._0_4_ = auVar110._0_4_ * auVar94._0_4_;
      auVar36._8_4_ = auVar110._8_4_ * auVar94._8_4_;
      auVar36._12_4_ = auVar110._12_4_ * auVar94._12_4_;
      auVar36._16_4_ = auVar110._16_4_ * auVar94._16_4_;
      auVar36._20_4_ = auVar110._20_4_ * auVar94._20_4_;
      auVar36._24_4_ = auVar110._24_4_ * auVar94._24_4_;
      auVar36._28_4_ = auVar105._28_4_;
      auVar37._4_4_ = -auVar109._4_4_ * auVar94._4_4_;
      auVar37._0_4_ = -auVar109._0_4_ * auVar94._0_4_;
      auVar37._8_4_ = -auVar109._8_4_ * auVar94._8_4_;
      auVar37._12_4_ = -auVar109._12_4_ * auVar94._12_4_;
      auVar37._16_4_ = -fVar177 * auVar94._16_4_;
      auVar37._20_4_ = -fVar156 * auVar94._20_4_;
      auVar37._24_4_ = -fVar168 * auVar94._24_4_;
      auVar37._28_4_ = auVar95._28_4_;
      auVar94 = vmulps_avx512vl(auVar94,auVar92);
      auVar83 = vfmadd213ps_fma(auVar33,auVar91,auVar99);
      auVar86 = vfmadd213ps_fma(auVar34,auVar91,auVar100);
      auVar95 = vfmadd213ps_avx512vl(auVar96,auVar91,auVar104);
      auVar105 = vfmadd213ps_avx512vl(auVar36,ZEXT1632(auVar10),ZEXT1632(auVar8));
      auVar87 = vfnmadd213ps_fma(auVar33,auVar91,auVar99);
      auVar103 = ZEXT1632(auVar10);
      auVar85 = vfmadd213ps_fma(auVar37,auVar103,ZEXT1632(auVar9));
      auVar160 = vfnmadd213ps_fma(auVar34,auVar91,auVar100);
      auVar84 = vfmadd213ps_fma(auVar94,auVar103,auVar97);
      auVar98 = vfnmadd231ps_avx512vl(auVar104,auVar91,auVar96);
      auVar8 = vfnmadd213ps_fma(auVar36,auVar103,ZEXT1632(auVar8));
      auVar9 = vfnmadd213ps_fma(auVar37,auVar103,ZEXT1632(auVar9));
      auVar169 = vfnmadd231ps_fma(auVar97,ZEXT1632(auVar10),auVar94);
      auVar94 = vsubps_avx512vl(auVar105,ZEXT1632(auVar87));
      auVar96 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar160));
      auVar97 = vsubps_avx512vl(ZEXT1632(auVar84),auVar98);
      auVar104 = vmulps_avx512vl(auVar96,auVar98);
      auVar6 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar160),auVar97);
      auVar38._4_4_ = auVar87._4_4_ * auVar97._4_4_;
      auVar38._0_4_ = auVar87._0_4_ * auVar97._0_4_;
      auVar38._8_4_ = auVar87._8_4_ * auVar97._8_4_;
      auVar38._12_4_ = auVar87._12_4_ * auVar97._12_4_;
      auVar38._16_4_ = auVar97._16_4_ * 0.0;
      auVar38._20_4_ = auVar97._20_4_ * 0.0;
      auVar38._24_4_ = auVar97._24_4_ * 0.0;
      auVar38._28_4_ = auVar97._28_4_;
      auVar97 = vfmsub231ps_avx512vl(auVar38,auVar98,auVar94);
      auVar39._4_4_ = auVar160._4_4_ * auVar94._4_4_;
      auVar39._0_4_ = auVar160._0_4_ * auVar94._0_4_;
      auVar39._8_4_ = auVar160._8_4_ * auVar94._8_4_;
      auVar39._12_4_ = auVar160._12_4_ * auVar94._12_4_;
      auVar39._16_4_ = auVar94._16_4_ * 0.0;
      auVar39._20_4_ = auVar94._20_4_ * 0.0;
      auVar39._24_4_ = auVar94._24_4_ * 0.0;
      auVar39._28_4_ = auVar94._28_4_;
      auVar7 = vfmsub231ps_fma(auVar39,ZEXT1632(auVar87),auVar96);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar7),auVar92,auVar97);
      auVar96 = vfmadd231ps_avx512vl(auVar96,auVar92,ZEXT1632(auVar6));
      auVar93 = ZEXT1632(auVar88);
      uVar70 = vcmpps_avx512vl(auVar96,auVar93,2);
      bVar68 = (byte)uVar70;
      fVar81 = (float)((uint)(bVar68 & 1) * auVar83._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar8._0_4_
                      );
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar167 = (float)((uint)bVar15 * auVar83._4_4_ | (uint)!bVar15 * auVar8._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar133 = (float)((uint)bVar15 * auVar83._8_4_ | (uint)!bVar15 * auVar8._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar136 = (float)((uint)bVar15 * auVar83._12_4_ | (uint)!bVar15 * auVar8._12_4_);
      auVar104 = ZEXT1632(CONCAT412(fVar136,CONCAT48(fVar133,CONCAT44(fVar167,fVar81))));
      fVar82 = (float)((uint)(bVar68 & 1) * auVar86._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar9._0_4_
                      );
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      fVar132 = (float)((uint)bVar15 * auVar86._4_4_ | (uint)!bVar15 * auVar9._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      fVar134 = (float)((uint)bVar15 * auVar86._8_4_ | (uint)!bVar15 * auVar9._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      fVar137 = (float)((uint)bVar15 * auVar86._12_4_ | (uint)!bVar15 * auVar9._12_4_);
      auVar103 = ZEXT1632(CONCAT412(fVar137,CONCAT48(fVar134,CONCAT44(fVar132,fVar82))));
      auVar111._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar169._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar111._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar169._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar111._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar169._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar111._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar169._12_4_);
      fVar155 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar95._16_4_);
      auVar111._16_4_ = fVar155;
      fVar159 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar95._20_4_);
      auVar111._20_4_ = fVar159;
      fVar140 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar95._24_4_);
      auVar111._24_4_ = fVar140;
      iVar1 = (uint)(byte)(uVar70 >> 7) * auVar95._28_4_;
      auVar111._28_4_ = iVar1;
      auVar94 = vblendmps_avx512vl(ZEXT1632(auVar87),auVar105);
      auVar112._0_4_ =
           (uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar86._0_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar86._4_4_;
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar86._8_4_;
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar86._12_4_;
      auVar112._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_;
      auVar112._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_;
      auVar112._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_;
      auVar112._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar94._28_4_;
      auVar94 = vblendmps_avx512vl(ZEXT1632(auVar160),ZEXT1632(auVar85));
      auVar113._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar6._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar6._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar6._12_4_);
      fVar156 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar94._16_4_);
      auVar113._16_4_ = fVar156;
      fVar168 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar94._20_4_);
      auVar113._20_4_ = fVar168;
      fVar177 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar94._24_4_);
      auVar113._24_4_ = fVar177;
      auVar113._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar94._28_4_;
      auVar94 = vblendmps_avx512vl(auVar98,ZEXT1632(auVar84));
      auVar114._0_4_ =
           (float)((uint)(bVar68 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar95._0_4_);
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar114._4_4_ = (float)((uint)bVar15 * auVar94._4_4_ | (uint)!bVar15 * auVar95._4_4_);
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar114._8_4_ = (float)((uint)bVar15 * auVar94._8_4_ | (uint)!bVar15 * auVar95._8_4_);
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar114._12_4_ = (float)((uint)bVar15 * auVar94._12_4_ | (uint)!bVar15 * auVar95._12_4_);
      bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
      auVar114._16_4_ = (float)((uint)bVar15 * auVar94._16_4_ | (uint)!bVar15 * auVar95._16_4_);
      bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
      auVar114._20_4_ = (float)((uint)bVar15 * auVar94._20_4_ | (uint)!bVar15 * auVar95._20_4_);
      bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
      auVar114._24_4_ = (float)((uint)bVar15 * auVar94._24_4_ | (uint)!bVar15 * auVar95._24_4_);
      bVar15 = SUB81(uVar70 >> 7,0);
      auVar114._28_4_ = (uint)bVar15 * auVar94._28_4_ | (uint)!bVar15 * auVar95._28_4_;
      auVar115._0_4_ =
           (uint)(bVar68 & 1) * (int)auVar87._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar105._0_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar115._4_4_ = (uint)bVar15 * (int)auVar87._4_4_ | (uint)!bVar15 * auVar105._4_4_;
      bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar115._8_4_ = (uint)bVar15 * (int)auVar87._8_4_ | (uint)!bVar15 * auVar105._8_4_;
      bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar115._12_4_ = (uint)bVar15 * (int)auVar87._12_4_ | (uint)!bVar15 * auVar105._12_4_;
      auVar115._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar105._16_4_;
      auVar115._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar105._20_4_;
      auVar115._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar105._24_4_;
      auVar115._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar105._28_4_;
      bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
      bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
      bVar18 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._0_4_ =
           (uint)(bVar68 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar84._0_4_;
      bVar16 = (bool)((byte)(uVar70 >> 1) & 1);
      auVar116._4_4_ = (uint)bVar16 * auVar98._4_4_ | (uint)!bVar16 * auVar84._4_4_;
      bVar16 = (bool)((byte)(uVar70 >> 2) & 1);
      auVar116._8_4_ = (uint)bVar16 * auVar98._8_4_ | (uint)!bVar16 * auVar84._8_4_;
      bVar16 = (bool)((byte)(uVar70 >> 3) & 1);
      auVar116._12_4_ = (uint)bVar16 * auVar98._12_4_ | (uint)!bVar16 * auVar84._12_4_;
      auVar116._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar98._16_4_;
      auVar116._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar98._20_4_;
      auVar116._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar98._24_4_;
      iVar2 = (uint)(byte)(uVar70 >> 7) * auVar98._28_4_;
      auVar116._28_4_ = iVar2;
      auVar99 = vsubps_avx512vl(auVar115,auVar104);
      auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar160._12_4_ |
                                              (uint)!bVar18 * auVar85._12_4_,
                                              CONCAT48((uint)bVar17 * (int)auVar160._8_4_ |
                                                       (uint)!bVar17 * auVar85._8_4_,
                                                       CONCAT44((uint)bVar15 * (int)auVar160._4_4_ |
                                                                (uint)!bVar15 * auVar85._4_4_,
                                                                (uint)(bVar68 & 1) *
                                                                (int)auVar160._0_4_ |
                                                                (uint)!(bool)(bVar68 & 1) *
                                                                auVar85._0_4_)))),auVar103);
      auVar187 = ZEXT3264(auVar94);
      auVar95 = vsubps_avx(auVar116,auVar111);
      auVar105 = vsubps_avx(auVar104,auVar112);
      auVar191 = ZEXT3264(auVar105);
      auVar98 = vsubps_avx(auVar103,auVar113);
      auVar97 = vsubps_avx(auVar111,auVar114);
      auVar40._4_4_ = auVar95._4_4_ * fVar167;
      auVar40._0_4_ = auVar95._0_4_ * fVar81;
      auVar40._8_4_ = auVar95._8_4_ * fVar133;
      auVar40._12_4_ = auVar95._12_4_ * fVar136;
      auVar40._16_4_ = auVar95._16_4_ * 0.0;
      auVar40._20_4_ = auVar95._20_4_ * 0.0;
      auVar40._24_4_ = auVar95._24_4_ * 0.0;
      auVar40._28_4_ = iVar2;
      auVar83 = vfmsub231ps_fma(auVar40,auVar111,auVar99);
      auVar41._4_4_ = fVar132 * auVar99._4_4_;
      auVar41._0_4_ = fVar82 * auVar99._0_4_;
      auVar41._8_4_ = fVar134 * auVar99._8_4_;
      auVar41._12_4_ = fVar137 * auVar99._12_4_;
      auVar41._16_4_ = auVar99._16_4_ * 0.0;
      auVar41._20_4_ = auVar99._20_4_ * 0.0;
      auVar41._24_4_ = auVar99._24_4_ * 0.0;
      auVar41._28_4_ = auVar96._28_4_;
      auVar86 = vfmsub231ps_fma(auVar41,auVar104,auVar94);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar93,ZEXT1632(auVar83));
      auVar178._0_4_ = auVar94._0_4_ * auVar111._0_4_;
      auVar178._4_4_ = auVar94._4_4_ * auVar111._4_4_;
      auVar178._8_4_ = auVar94._8_4_ * auVar111._8_4_;
      auVar178._12_4_ = auVar94._12_4_ * auVar111._12_4_;
      auVar178._16_4_ = auVar94._16_4_ * fVar155;
      auVar178._20_4_ = auVar94._20_4_ * fVar159;
      auVar178._24_4_ = auVar94._24_4_ * fVar140;
      auVar178._28_4_ = 0;
      auVar83 = vfmsub231ps_fma(auVar178,auVar103,auVar95);
      auVar100 = vfmadd231ps_avx512vl(auVar96,auVar93,ZEXT1632(auVar83));
      auVar96 = vmulps_avx512vl(auVar97,auVar112);
      auVar96 = vfmsub231ps_avx512vl(auVar96,auVar105,auVar114);
      auVar42._4_4_ = auVar98._4_4_ * auVar114._4_4_;
      auVar42._0_4_ = auVar98._0_4_ * auVar114._0_4_;
      auVar42._8_4_ = auVar98._8_4_ * auVar114._8_4_;
      auVar42._12_4_ = auVar98._12_4_ * auVar114._12_4_;
      auVar42._16_4_ = auVar98._16_4_ * auVar114._16_4_;
      auVar42._20_4_ = auVar98._20_4_ * auVar114._20_4_;
      auVar42._24_4_ = auVar98._24_4_ * auVar114._24_4_;
      auVar42._28_4_ = auVar114._28_4_;
      auVar83 = vfmsub231ps_fma(auVar42,auVar113,auVar97);
      auVar179._0_4_ = auVar113._0_4_ * auVar105._0_4_;
      auVar179._4_4_ = auVar113._4_4_ * auVar105._4_4_;
      auVar179._8_4_ = auVar113._8_4_ * auVar105._8_4_;
      auVar179._12_4_ = auVar113._12_4_ * auVar105._12_4_;
      auVar179._16_4_ = fVar156 * auVar105._16_4_;
      auVar179._20_4_ = fVar168 * auVar105._20_4_;
      auVar179._24_4_ = fVar177 * auVar105._24_4_;
      auVar179._28_4_ = 0;
      auVar86 = vfmsub231ps_fma(auVar179,auVar98,auVar112);
      auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar93,auVar96);
      auVar92 = vfmadd231ps_avx512vl(auVar96,auVar93,ZEXT1632(auVar83));
      auVar182 = ZEXT3264(auVar92);
      auVar96 = vmaxps_avx(auVar100,auVar92);
      uVar157 = vcmpps_avx512vl(auVar96,auVar93,2);
      bVar79 = bVar79 & (byte)uVar157;
      if (bVar79 != 0) {
        auVar43._4_4_ = auVar97._4_4_ * auVar94._4_4_;
        auVar43._0_4_ = auVar97._0_4_ * auVar94._0_4_;
        auVar43._8_4_ = auVar97._8_4_ * auVar94._8_4_;
        auVar43._12_4_ = auVar97._12_4_ * auVar94._12_4_;
        auVar43._16_4_ = auVar97._16_4_ * auVar94._16_4_;
        auVar43._20_4_ = auVar97._20_4_ * auVar94._20_4_;
        auVar43._24_4_ = auVar97._24_4_ * auVar94._24_4_;
        auVar43._28_4_ = auVar96._28_4_;
        auVar84 = vfmsub231ps_fma(auVar43,auVar98,auVar95);
        auVar44._4_4_ = auVar95._4_4_ * auVar105._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar105._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar105._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar105._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar105._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar105._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar105._24_4_;
        auVar44._28_4_ = auVar95._28_4_;
        auVar85 = vfmsub231ps_fma(auVar44,auVar99,auVar97);
        auVar45._4_4_ = auVar98._4_4_ * auVar99._4_4_;
        auVar45._0_4_ = auVar98._0_4_ * auVar99._0_4_;
        auVar45._8_4_ = auVar98._8_4_ * auVar99._8_4_;
        auVar45._12_4_ = auVar98._12_4_ * auVar99._12_4_;
        auVar45._16_4_ = auVar98._16_4_ * auVar99._16_4_;
        auVar45._20_4_ = auVar98._20_4_ * auVar99._20_4_;
        auVar45._24_4_ = auVar98._24_4_ * auVar99._24_4_;
        auVar45._28_4_ = auVar98._28_4_;
        auVar6 = vfmsub231ps_fma(auVar45,auVar105,auVar94);
        auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar6));
        auVar86 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar84),ZEXT1232(ZEXT412(0)) << 0x20);
        auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
        auVar191 = ZEXT3264(auVar96);
        auVar22._8_4_ = 0x3f800000;
        auVar22._0_8_ = 0x3f8000003f800000;
        auVar22._12_4_ = 0x3f800000;
        auVar22._16_4_ = 0x3f800000;
        auVar22._20_4_ = 0x3f800000;
        auVar22._24_4_ = 0x3f800000;
        auVar22._28_4_ = 0x3f800000;
        auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar86),auVar22);
        auVar83 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
        auVar187 = ZEXT1664(auVar83);
        auVar46._4_4_ = auVar6._4_4_ * auVar111._4_4_;
        auVar46._0_4_ = auVar6._0_4_ * auVar111._0_4_;
        auVar46._8_4_ = auVar6._8_4_ * auVar111._8_4_;
        auVar46._12_4_ = auVar6._12_4_ * auVar111._12_4_;
        auVar46._16_4_ = fVar155 * 0.0;
        auVar46._20_4_ = fVar159 * 0.0;
        auVar46._24_4_ = fVar140 * 0.0;
        auVar46._28_4_ = iVar1;
        auVar85 = vfmadd231ps_fma(auVar46,auVar103,ZEXT1632(auVar85));
        auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar104,ZEXT1632(auVar84));
        fVar159 = auVar83._0_4_;
        fVar140 = auVar83._4_4_;
        fVar155 = auVar83._8_4_;
        fVar156 = auVar83._12_4_;
        local_280 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar156,
                                       CONCAT48(auVar85._8_4_ * fVar155,
                                                CONCAT44(auVar85._4_4_ * fVar140,
                                                         auVar85._0_4_ * fVar159))));
        auVar193 = ZEXT3264(local_280);
        auVar147._4_4_ = local_480;
        auVar147._0_4_ = local_480;
        auVar147._8_4_ = local_480;
        auVar147._12_4_ = local_480;
        auVar147._16_4_ = local_480;
        auVar147._20_4_ = local_480;
        auVar147._24_4_ = local_480;
        auVar147._28_4_ = local_480;
        uVar157 = vcmpps_avx512vl(auVar147,local_280,2);
        uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar141;
        auVar23._0_4_ = uVar141;
        auVar23._8_4_ = uVar141;
        auVar23._12_4_ = uVar141;
        auVar23._16_4_ = uVar141;
        auVar23._20_4_ = uVar141;
        auVar23._24_4_ = uVar141;
        auVar23._28_4_ = uVar141;
        uVar21 = vcmpps_avx512vl(local_280,auVar23,2);
        bVar79 = (byte)uVar157 & (byte)uVar21 & bVar79;
        if (bVar79 != 0) {
          uVar80 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar80 = bVar79 & uVar80;
          if ((char)uVar80 != '\0') {
            fVar168 = auVar100._0_4_ * fVar159;
            fVar177 = auVar100._4_4_ * fVar140;
            auVar47._4_4_ = fVar177;
            auVar47._0_4_ = fVar168;
            fVar81 = auVar100._8_4_ * fVar155;
            auVar47._8_4_ = fVar81;
            fVar82 = auVar100._12_4_ * fVar156;
            auVar47._12_4_ = fVar82;
            fVar167 = auVar100._16_4_ * 0.0;
            auVar47._16_4_ = fVar167;
            fVar132 = auVar100._20_4_ * 0.0;
            auVar47._20_4_ = fVar132;
            fVar133 = auVar100._24_4_ * 0.0;
            auVar47._24_4_ = fVar133;
            auVar47._28_4_ = auVar100._28_4_;
            auVar148._8_4_ = 0x3f800000;
            auVar148._0_8_ = 0x3f8000003f800000;
            auVar148._12_4_ = 0x3f800000;
            auVar148._16_4_ = 0x3f800000;
            auVar148._20_4_ = 0x3f800000;
            auVar148._24_4_ = 0x3f800000;
            auVar148._28_4_ = 0x3f800000;
            auVar96 = vsubps_avx(auVar148,auVar47);
            local_2c0._0_4_ =
                 (float)((uint)(bVar68 & 1) * (int)fVar168 |
                        (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
            bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
            local_2c0._4_4_ = (float)((uint)bVar15 * (int)fVar177 | (uint)!bVar15 * auVar96._4_4_);
            bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
            local_2c0._8_4_ = (float)((uint)bVar15 * (int)fVar81 | (uint)!bVar15 * auVar96._8_4_);
            bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
            local_2c0._12_4_ = (float)((uint)bVar15 * (int)fVar82 | (uint)!bVar15 * auVar96._12_4_);
            bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
            local_2c0._16_4_ = (float)((uint)bVar15 * (int)fVar167 | (uint)!bVar15 * auVar96._16_4_)
            ;
            bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
            local_2c0._20_4_ = (float)((uint)bVar15 * (int)fVar132 | (uint)!bVar15 * auVar96._20_4_)
            ;
            bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
            local_2c0._24_4_ = (float)((uint)bVar15 * (int)fVar133 | (uint)!bVar15 * auVar96._24_4_)
            ;
            bVar15 = SUB81(uVar70 >> 7,0);
            local_2c0._28_4_ =
                 (float)((uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar96._28_4_);
            auVar96 = vsubps_avx(ZEXT1632(auVar10),auVar91);
            auVar83 = vfmadd213ps_fma(auVar96,local_2c0,auVar91);
            uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
            auVar24._4_4_ = uVar141;
            auVar24._0_4_ = uVar141;
            auVar24._8_4_ = uVar141;
            auVar24._12_4_ = uVar141;
            auVar24._16_4_ = uVar141;
            auVar24._20_4_ = uVar141;
            auVar24._24_4_ = uVar141;
            auVar24._28_4_ = uVar141;
            auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                         CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                  CONCAT44(auVar83._4_4_ +
                                                                           auVar83._4_4_,
                                                                           auVar83._0_4_ +
                                                                           auVar83._0_4_)))),auVar24
                                     );
            uVar73 = vcmpps_avx512vl(local_280,auVar96,6);
            uVar80 = uVar80 & uVar73;
            bVar79 = (byte)uVar80;
            if (bVar79 != 0) {
              auVar165._0_4_ = auVar92._0_4_ * fVar159;
              auVar165._4_4_ = auVar92._4_4_ * fVar140;
              auVar165._8_4_ = auVar92._8_4_ * fVar155;
              auVar165._12_4_ = auVar92._12_4_ * fVar156;
              auVar165._16_4_ = auVar92._16_4_ * 0.0;
              auVar165._20_4_ = auVar92._20_4_ * 0.0;
              auVar165._24_4_ = auVar92._24_4_ * 0.0;
              auVar165._28_4_ = 0;
              auVar174._8_4_ = 0x3f800000;
              auVar174._0_8_ = 0x3f8000003f800000;
              auVar174._12_4_ = 0x3f800000;
              auVar174._16_4_ = 0x3f800000;
              auVar174._20_4_ = 0x3f800000;
              auVar174._24_4_ = 0x3f800000;
              auVar174._28_4_ = 0x3f800000;
              auVar96 = vsubps_avx(auVar174,auVar165);
              auVar117._0_4_ =
                   (uint)(bVar68 & 1) * (int)auVar165._0_4_ |
                   (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
              bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
              auVar117._4_4_ = (uint)bVar15 * (int)auVar165._4_4_ | (uint)!bVar15 * auVar96._4_4_;
              bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
              auVar117._8_4_ = (uint)bVar15 * (int)auVar165._8_4_ | (uint)!bVar15 * auVar96._8_4_;
              bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
              auVar117._12_4_ = (uint)bVar15 * (int)auVar165._12_4_ | (uint)!bVar15 * auVar96._12_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
              auVar117._16_4_ = (uint)bVar15 * (int)auVar165._16_4_ | (uint)!bVar15 * auVar96._16_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
              auVar117._20_4_ = (uint)bVar15 * (int)auVar165._20_4_ | (uint)!bVar15 * auVar96._20_4_
              ;
              bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
              auVar117._24_4_ = (uint)bVar15 * (int)auVar165._24_4_ | (uint)!bVar15 * auVar96._24_4_
              ;
              auVar117._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar96._28_4_;
              auVar25._8_4_ = 0x40000000;
              auVar25._0_8_ = 0x4000000040000000;
              auVar25._12_4_ = 0x40000000;
              auVar25._16_4_ = 0x40000000;
              auVar25._20_4_ = 0x40000000;
              auVar25._24_4_ = 0x40000000;
              auVar25._28_4_ = 0x40000000;
              local_2a0 = vfmsub132ps_avx512vl(auVar117,auVar174,auVar25);
              local_260 = 0;
              local_25c = iVar12;
              auVar191 = ZEXT1664(local_5d0);
              local_250 = local_5d0;
              local_240 = local_5a0._0_8_;
              uStack_238 = local_5a0._8_8_;
              local_230 = local_5b0._0_8_;
              uStack_228 = local_5b0._8_8_;
              local_220 = local_5c0;
              uStack_218 = uStack_5b8;
              if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar159 = 1.0 / auVar198._0_4_;
                local_200[0] = fVar159 * (local_2c0._0_4_ + 0.0);
                local_200[1] = fVar159 * (local_2c0._4_4_ + 1.0);
                local_200[2] = fVar159 * (local_2c0._8_4_ + 2.0);
                local_200[3] = fVar159 * (local_2c0._12_4_ + 3.0);
                fStack_1f0 = fVar159 * (local_2c0._16_4_ + 4.0);
                fStack_1ec = fVar159 * (local_2c0._20_4_ + 5.0);
                fStack_1e8 = fVar159 * (local_2c0._24_4_ + 6.0);
                fStack_1e4 = local_2c0._28_4_ + 7.0;
                local_1e0 = local_2a0;
                local_1c0 = local_280;
                auVar149._8_4_ = 0x7f800000;
                auVar149._0_8_ = 0x7f8000007f800000;
                auVar149._12_4_ = 0x7f800000;
                auVar149._16_4_ = 0x7f800000;
                auVar149._20_4_ = 0x7f800000;
                auVar149._24_4_ = 0x7f800000;
                auVar149._28_4_ = 0x7f800000;
                auVar96 = vblendmps_avx512vl(auVar149,local_280);
                auVar118._0_4_ =
                     (uint)(bVar79 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
                auVar118._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
                auVar118._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
                auVar118._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                auVar118._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
                auVar118._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
                auVar118._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * 0x7f800000;
                bVar15 = SUB81(uVar80 >> 7,0);
                auVar118._28_4_ = (uint)bVar15 * auVar96._28_4_ | (uint)!bVar15 * 0x7f800000;
                auVar96 = vshufps_avx(auVar118,auVar118,0xb1);
                auVar96 = vminps_avx(auVar118,auVar96);
                auVar94 = vshufpd_avx(auVar96,auVar96,5);
                auVar96 = vminps_avx(auVar96,auVar94);
                auVar94 = vpermpd_avx2(auVar96,0x4e);
                auVar96 = vminps_avx(auVar96,auVar94);
                uVar157 = vcmpps_avx512vl(auVar118,auVar96,0);
                uVar71 = (uint)uVar80;
                if ((bVar79 & (byte)uVar157) != 0) {
                  uVar71 = (uint)(bVar79 & (byte)uVar157);
                }
                uVar72 = 0;
                for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                  uVar72 = uVar72 + 1;
                }
                uVar70 = (ulong)uVar72;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_4a0 = *(undefined4 *)(ray + k * 4 + 0x80);
                  uStack_49c = 0;
                  uStack_498 = 0;
                  uStack_494 = 0;
                  local_540 = auVar90;
                  local_520 = local_280;
                  do {
                    local_420 = local_200[uVar70];
                    local_410 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                    local_590.context = context->user;
                    fVar140 = 1.0 - local_420;
                    fVar159 = fVar140 * fVar140 * -3.0;
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * fVar140)),
                                              ZEXT416((uint)(local_420 * fVar140)),
                                              ZEXT416(0xc0000000));
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar140)),
                                              ZEXT416((uint)(local_420 * local_420)),
                                              ZEXT416(0x40000000));
                    fVar140 = auVar83._0_4_ * 3.0;
                    fVar155 = auVar86._0_4_ * 3.0;
                    fVar156 = local_420 * local_420 * 3.0;
                    auVar186._0_4_ = fVar156 * (float)local_5c0._0_4_;
                    auVar186._4_4_ = fVar156 * (float)local_5c0._4_4_;
                    auVar186._8_4_ = fVar156 * (float)uStack_5b8;
                    auVar186._12_4_ = fVar156 * uStack_5b8._4_4_;
                    auVar187 = ZEXT1664(auVar186);
                    auVar144._4_4_ = fVar155;
                    auVar144._0_4_ = fVar155;
                    auVar144._8_4_ = fVar155;
                    auVar144._12_4_ = fVar155;
                    auVar83 = vfmadd132ps_fma(auVar144,auVar186,local_5b0);
                    auVar173._4_4_ = fVar140;
                    auVar173._0_4_ = fVar140;
                    auVar173._8_4_ = fVar140;
                    auVar173._12_4_ = fVar140;
                    auVar83 = vfmadd132ps_fma(auVar173,auVar83,local_5a0);
                    auVar145._4_4_ = fVar159;
                    auVar145._0_4_ = fVar159;
                    auVar145._8_4_ = fVar159;
                    auVar145._12_4_ = fVar159;
                    auVar83 = vfmadd213ps_fma(auVar145,auVar191._0_16_,auVar83);
                    local_450 = auVar83._0_4_;
                    local_440 = vshufps_avx(auVar83,auVar83,0x55);
                    auVar182 = ZEXT1664(local_440);
                    local_430 = vshufps_avx(auVar83,auVar83,0xaa);
                    iStack_44c = local_450;
                    iStack_448 = local_450;
                    iStack_444 = local_450;
                    fStack_41c = local_420;
                    fStack_418 = local_420;
                    fStack_414 = local_420;
                    uStack_40c = local_410;
                    uStack_408 = local_410;
                    uStack_404 = local_410;
                    local_400 = local_4c0._0_8_;
                    uStack_3f8 = local_4c0._8_8_;
                    local_3f0 = local_4b0;
                    vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                    uStack_3dc = (local_590.context)->instID[0];
                    local_3e0 = uStack_3dc;
                    uStack_3d8 = uStack_3dc;
                    uStack_3d4 = uStack_3dc;
                    uStack_3d0 = (local_590.context)->instPrimID[0];
                    uStack_3cc = uStack_3d0;
                    uStack_3c8 = uStack_3d0;
                    uStack_3c4 = uStack_3d0;
                    local_5e0 = local_4d0;
                    local_590.valid = (int *)local_5e0;
                    local_590.geometryUserPtr = pGVar75->userPtr;
                    local_590.hit = (RTCHitN *)&local_450;
                    local_590.N = 4;
                    local_590.ray = (RTCRayN *)ray;
                    if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar182 = ZEXT1664(local_440);
                      auVar187 = ZEXT1664(auVar186);
                      (*pGVar75->intersectionFilterN)(&local_590);
                      auVar193 = ZEXT3264(local_520);
                      auVar206 = ZEXT3264(local_540);
                      auVar191 = ZEXT1664(local_5d0);
                      auVar209 = ZEXT464(0x35000000);
                      auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar208 = ZEXT1664(auVar83);
                      auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar207 = ZEXT3264(auVar96);
                      ray = local_550;
                    }
                    uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                    if ((uVar73 & 0xf) == 0) {
LAB_019b478c:
                      *(undefined4 *)(ray + k * 4 + 0x80) = local_4a0;
                    }
                    else {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar182 = ZEXT1664(auVar182._0_16_);
                        auVar187 = ZEXT1664(auVar187._0_16_);
                        (*p_Var14)(&local_590);
                        auVar193 = ZEXT3264(local_520);
                        auVar206 = ZEXT3264(local_540);
                        auVar191 = ZEXT1664(local_5d0);
                        auVar209 = ZEXT464(0x35000000);
                        auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar208 = ZEXT1664(auVar83);
                        auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
                        auVar207 = ZEXT3264(auVar96);
                        ray = local_550;
                      }
                      uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                      uVar73 = uVar73 & 0xf;
                      bVar79 = (byte)uVar73;
                      if (bVar79 == 0) goto LAB_019b478c;
                      iVar1 = *(int *)(local_590.hit + 4);
                      iVar2 = *(int *)(local_590.hit + 8);
                      iVar65 = *(int *)(local_590.hit + 0xc);
                      bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar17 = SUB81(uVar73 >> 3,0);
                      *(uint *)(local_590.ray + 0xc0) =
                           (uint)(bVar79 & 1) * *(int *)local_590.hit |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xc0);
                      *(uint *)(local_590.ray + 0xc4) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xc4);
                      *(uint *)(local_590.ray + 200) =
                           (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 200);
                      *(uint *)(local_590.ray + 0xcc) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_590.ray + 0xcc);
                      iVar1 = *(int *)(local_590.hit + 0x14);
                      iVar2 = *(int *)(local_590.hit + 0x18);
                      iVar65 = *(int *)(local_590.hit + 0x1c);
                      bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar17 = SUB81(uVar73 >> 3,0);
                      *(uint *)(local_590.ray + 0xd0) =
                           (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x10) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xd0);
                      *(uint *)(local_590.ray + 0xd4) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xd4);
                      *(uint *)(local_590.ray + 0xd8) =
                           (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xd8);
                      *(uint *)(local_590.ray + 0xdc) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_590.ray + 0xdc);
                      iVar1 = *(int *)(local_590.hit + 0x24);
                      iVar2 = *(int *)(local_590.hit + 0x28);
                      iVar65 = *(int *)(local_590.hit + 0x2c);
                      bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar17 = SUB81(uVar73 >> 3,0);
                      *(uint *)(local_590.ray + 0xe0) =
                           (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x20) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xe0);
                      *(uint *)(local_590.ray + 0xe4) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xe4);
                      *(uint *)(local_590.ray + 0xe8) =
                           (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xe8);
                      *(uint *)(local_590.ray + 0xec) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_590.ray + 0xec);
                      iVar1 = *(int *)(local_590.hit + 0x34);
                      iVar2 = *(int *)(local_590.hit + 0x38);
                      iVar65 = *(int *)(local_590.hit + 0x3c);
                      bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar17 = SUB81(uVar73 >> 3,0);
                      *(uint *)(local_590.ray + 0xf0) =
                           (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x30) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xf0);
                      *(uint *)(local_590.ray + 0xf4) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xf4);
                      *(uint *)(local_590.ray + 0xf8) =
                           (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xf8);
                      *(uint *)(local_590.ray + 0xfc) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_590.ray + 0xfc);
                      iVar1 = *(int *)(local_590.hit + 0x44);
                      iVar2 = *(int *)(local_590.hit + 0x48);
                      iVar65 = *(int *)(local_590.hit + 0x4c);
                      bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                      bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                      bVar17 = SUB81(uVar73 >> 3,0);
                      *(uint *)(local_590.ray + 0x100) =
                           (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x40) |
                           (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0x100);
                      *(uint *)(local_590.ray + 0x104) =
                           (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0x104);
                      *(uint *)(local_590.ray + 0x108) =
                           (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0x108);
                      *(uint *)(local_590.ray + 0x10c) =
                           (uint)bVar17 * iVar65 | (uint)!bVar17 * *(int *)(local_590.ray + 0x10c);
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50));
                      *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                      auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60));
                      *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70));
                      *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                      auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80));
                      *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                      local_4a0 = *(undefined4 *)(ray + k * 4 + 0x80);
                      uStack_49c = 0;
                      uStack_498 = 0;
                      uStack_494 = 0;
                    }
                    auVar90 = auVar206._0_32_;
                    bVar79 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar80;
                    auVar153._4_4_ = local_4a0;
                    auVar153._0_4_ = local_4a0;
                    auVar153._8_4_ = local_4a0;
                    auVar153._12_4_ = local_4a0;
                    auVar153._16_4_ = local_4a0;
                    auVar153._20_4_ = local_4a0;
                    auVar153._24_4_ = local_4a0;
                    auVar153._28_4_ = local_4a0;
                    uVar157 = vcmpps_avx512vl(auVar193._0_32_,auVar153,2);
                    if ((bVar79 & (byte)uVar157) == 0) goto LAB_019b36ef;
                    bVar79 = bVar79 & (byte)uVar157;
                    uVar80 = (ulong)bVar79;
                    auVar154._8_4_ = 0x7f800000;
                    auVar154._0_8_ = 0x7f8000007f800000;
                    auVar154._12_4_ = 0x7f800000;
                    auVar154._16_4_ = 0x7f800000;
                    auVar154._20_4_ = 0x7f800000;
                    auVar154._24_4_ = 0x7f800000;
                    auVar154._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar154,auVar193._0_32_);
                    auVar131._0_4_ =
                         (uint)(bVar79 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)(bVar79 >> 1 & 1);
                    auVar131._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar79 >> 2 & 1);
                    auVar131._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar79 >> 3 & 1);
                    auVar131._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar79 >> 4 & 1);
                    auVar131._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar79 >> 5 & 1);
                    auVar131._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)(bVar79 >> 6 & 1);
                    auVar131._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar131._28_4_ =
                         (uint)(bVar79 >> 7) * auVar96._28_4_ |
                         (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                    auVar96 = vshufps_avx(auVar131,auVar131,0xb1);
                    auVar96 = vminps_avx(auVar131,auVar96);
                    auVar94 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    auVar94 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    uVar157 = vcmpps_avx512vl(auVar131,auVar96,0);
                    bVar68 = (byte)uVar157 & bVar79;
                    if (bVar68 != 0) {
                      bVar79 = bVar68;
                    }
                    uVar71 = 0;
                    for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000
                        ) {
                      uVar71 = uVar71 + 1;
                    }
                    uVar70 = (ulong)uVar71;
                  } while( true );
                }
                fVar159 = local_200[uVar70];
                uVar141 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                fVar155 = 1.0 - fVar159;
                fVar140 = fVar155 * fVar155 * -3.0;
                auVar182 = ZEXT464((uint)fVar140);
                auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155)),
                                          ZEXT416((uint)(fVar159 * fVar155)),ZEXT416(0xc0000000));
                auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar159 * fVar155)),
                                          ZEXT416((uint)(fVar159 * fVar159)),ZEXT416(0x40000000));
                fVar155 = auVar83._0_4_ * 3.0;
                fVar156 = auVar86._0_4_ * 3.0;
                fVar168 = fVar159 * fVar159 * 3.0;
                auVar183._0_4_ = fVar168 * (float)local_5c0._0_4_;
                auVar183._4_4_ = fVar168 * (float)local_5c0._4_4_;
                auVar183._8_4_ = fVar168 * (float)uStack_5b8;
                auVar183._12_4_ = fVar168 * uStack_5b8._4_4_;
                auVar187 = ZEXT1664(auVar183);
                auVar161._4_4_ = fVar156;
                auVar161._0_4_ = fVar156;
                auVar161._8_4_ = fVar156;
                auVar161._12_4_ = fVar156;
                auVar83 = vfmadd132ps_fma(auVar161,auVar183,local_5b0);
                auVar170._4_4_ = fVar155;
                auVar170._0_4_ = fVar155;
                auVar170._8_4_ = fVar155;
                auVar170._12_4_ = fVar155;
                auVar83 = vfmadd132ps_fma(auVar170,auVar83,local_5a0);
                auVar162._4_4_ = fVar140;
                auVar162._0_4_ = fVar140;
                auVar162._8_4_ = fVar140;
                auVar162._12_4_ = fVar140;
                auVar83 = vfmadd213ps_fma(auVar162,local_5d0,auVar83);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                uVar13 = vextractps_avx(auVar83,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                uVar13 = vextractps_avx(auVar83,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                *(float *)(ray + k * 4 + 0xf0) = fVar159;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar141;
                *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                *(uint *)(ray + k * 4 + 0x120) = uVar11;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_019b36ef:
    if (8 < iVar12) {
      auVar96 = vpbroadcastd_avx512vl();
      auVar206 = ZEXT3264(auVar96);
      local_4a0 = local_560._0_4_;
      uStack_49c = local_560._0_4_;
      uStack_498 = local_560._0_4_;
      uStack_494 = local_560._0_4_;
      uStack_490 = local_560._0_4_;
      uStack_48c = local_560._0_4_;
      uStack_488 = local_560._0_4_;
      uStack_484 = local_560._0_4_;
      uStack_47c = local_480;
      uStack_478 = local_480;
      uStack_474 = local_480;
      uStack_470 = local_480;
      uStack_46c = local_480;
      uStack_468 = local_480;
      uStack_464 = local_480;
      local_120 = 1.0 / (float)local_500._0_4_;
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      lVar77 = 8;
      local_540 = auVar90;
LAB_019b3772:
      if (lVar77 < lVar74) {
        auVar96 = vpbroadcastd_avx512vl();
        auVar96 = vpor_avx2(auVar96,_DAT_01fb4ba0);
        uVar21 = vpcmpgtd_avx512vl(auVar206._0_32_,auVar96);
        auVar96 = *(undefined1 (*) [32])(bezier_basis0 + lVar77 * 4 + lVar78);
        auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fb768 + lVar77 * 4);
        auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21fbbec + lVar77 * 4);
        auVar105 = *(undefined1 (*) [32])(lVar78 + 0x21fc070 + lVar77 * 4);
        auVar193._0_4_ = auVar105._0_4_ * (float)local_3a0._0_4_;
        auVar193._4_4_ = auVar105._4_4_ * (float)local_3a0._4_4_;
        auVar193._8_4_ = auVar105._8_4_ * fStack_398;
        auVar193._12_4_ = auVar105._12_4_ * fStack_394;
        auVar193._16_4_ = auVar105._16_4_ * fStack_390;
        auVar193._20_4_ = auVar105._20_4_ * fStack_38c;
        auVar193._28_36_ = auVar187._28_36_;
        auVar193._24_4_ = auVar105._24_4_ * fStack_388;
        auVar187._0_4_ = auVar105._0_4_ * (float)local_3c0._0_4_;
        auVar187._4_4_ = auVar105._4_4_ * (float)local_3c0._4_4_;
        auVar187._8_4_ = auVar105._8_4_ * fStack_3b8;
        auVar187._12_4_ = auVar105._12_4_ * fStack_3b4;
        auVar187._16_4_ = auVar105._16_4_ * fStack_3b0;
        auVar187._20_4_ = auVar105._20_4_ * fStack_3ac;
        auVar187._28_36_ = auVar182._28_36_;
        auVar187._24_4_ = auVar105._24_4_ * fStack_3a8;
        auVar98 = vmulps_avx512vl(local_100,auVar105);
        auVar97 = vfmadd231ps_avx512vl(auVar193._0_32_,auVar95,local_360);
        auVar104 = vfmadd231ps_avx512vl(auVar187._0_32_,auVar95,local_380);
        auVar98 = vfmadd231ps_avx512vl(auVar98,auVar95,local_e0);
        auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_320);
        auVar104 = vfmadd231ps_avx512vl(auVar104,auVar94,local_340);
        auVar103 = vfmadd231ps_avx512vl(auVar98,auVar94,local_c0);
        auVar83 = vfmadd231ps_fma(auVar97,auVar96,local_2e0);
        auVar187 = ZEXT1664(auVar83);
        auVar86 = vfmadd231ps_fma(auVar104,auVar96,local_300);
        auVar182 = ZEXT1664(auVar86);
        auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar77 * 4 + lVar78);
        auVar97 = *(undefined1 (*) [32])(lVar78 + 0x21fdb88 + lVar77 * 4);
        auVar92 = vfmadd231ps_avx512vl(auVar103,auVar96,local_a0);
        auVar104 = *(undefined1 (*) [32])(lVar78 + 0x21fe00c + lVar77 * 4);
        auVar103 = *(undefined1 (*) [32])(lVar78 + 0x21fe490 + lVar77 * 4);
        auVar192._0_4_ = auVar103._0_4_ * (float)local_3a0._0_4_;
        auVar192._4_4_ = auVar103._4_4_ * (float)local_3a0._4_4_;
        auVar192._8_4_ = auVar103._8_4_ * fStack_398;
        auVar192._12_4_ = auVar103._12_4_ * fStack_394;
        auVar192._16_4_ = auVar103._16_4_ * fStack_390;
        auVar192._20_4_ = auVar103._20_4_ * fStack_38c;
        auVar192._28_36_ = auVar191._28_36_;
        auVar192._24_4_ = auVar103._24_4_ * fStack_388;
        auVar48._4_4_ = auVar103._4_4_ * (float)local_3c0._4_4_;
        auVar48._0_4_ = auVar103._0_4_ * (float)local_3c0._0_4_;
        auVar48._8_4_ = auVar103._8_4_ * fStack_3b8;
        auVar48._12_4_ = auVar103._12_4_ * fStack_3b4;
        auVar48._16_4_ = auVar103._16_4_ * fStack_3b0;
        auVar48._20_4_ = auVar103._20_4_ * fStack_3ac;
        auVar48._24_4_ = auVar103._24_4_ * fStack_3a8;
        auVar48._28_4_ = uStack_3a4;
        auVar99 = vmulps_avx512vl(local_100,auVar103);
        auVar100 = vfmadd231ps_avx512vl(auVar192._0_32_,auVar104,local_360);
        auVar93 = vfmadd231ps_avx512vl(auVar48,auVar104,local_380);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar104,local_e0);
        auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,local_320);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar97,local_340);
        auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,local_c0);
        auVar85 = vfmadd231ps_fma(auVar100,auVar98,local_2e0);
        auVar191 = ZEXT1664(auVar85);
        auVar84 = vfmadd231ps_fma(auVar93,auVar98,local_300);
        auVar93 = vfmadd231ps_avx512vl(auVar99,auVar98,local_a0);
        auVar90 = vmaxps_avx512vl(auVar92,auVar93);
        auVar99 = vsubps_avx(ZEXT1632(auVar85),ZEXT1632(auVar83));
        auVar100 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar86));
        auVar91 = vmulps_avx512vl(ZEXT1632(auVar86),auVar99);
        auVar101 = vmulps_avx512vl(ZEXT1632(auVar83),auVar100);
        auVar91 = vsubps_avx512vl(auVar91,auVar101);
        auVar101 = vmulps_avx512vl(auVar100,auVar100);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar99);
        auVar90 = vmulps_avx512vl(auVar90,auVar90);
        auVar90 = vmulps_avx512vl(auVar90,auVar101);
        auVar91 = vmulps_avx512vl(auVar91,auVar91);
        uVar157 = vcmpps_avx512vl(auVar91,auVar90,2);
        bVar79 = (byte)uVar21 & (byte)uVar157;
        if (bVar79 != 0) {
          auVar103 = vmulps_avx512vl(local_1a0,auVar103);
          auVar104 = vfmadd213ps_avx512vl(auVar104,local_180,auVar103);
          auVar97 = vfmadd213ps_avx512vl(auVar97,local_160,auVar104);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_540,auVar97);
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar95 = vfmadd213ps_avx512vl(auVar95,local_180,auVar105);
          auVar94 = vfmadd213ps_avx512vl(auVar94,local_160,auVar95);
          auVar97 = vfmadd213ps_avx512vl(auVar96,local_540,auVar94);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fc4f4 + lVar77 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fc978 + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21fcdfc + lVar77 * 4);
          auVar105 = *(undefined1 (*) [32])(lVar78 + 0x21fd280 + lVar77 * 4);
          auVar104 = vmulps_avx512vl(_local_3a0,auVar105);
          auVar103 = vmulps_avx512vl(_local_3c0,auVar105);
          auVar105 = vmulps_avx512vl(local_1a0,auVar105);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar95,local_360);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar95,local_380);
          auVar95 = vfmadd231ps_avx512vl(auVar105,local_180,auVar95);
          auVar105 = vfmadd231ps_avx512vl(auVar104,auVar94,local_320);
          auVar104 = vfmadd231ps_avx512vl(auVar103,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar96,local_2e0);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar96,local_300);
          auVar6 = vfmadd231ps_fma(auVar94,auVar96,local_540);
          auVar96 = *(undefined1 (*) [32])(lVar78 + 0x21fe914 + lVar77 * 4);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21ff21c + lVar77 * 4);
          auVar95 = *(undefined1 (*) [32])(lVar78 + 0x21ff6a0 + lVar77 * 4);
          auVar103 = vmulps_avx512vl(_local_3a0,auVar95);
          auVar90 = vmulps_avx512vl(_local_3c0,auVar95);
          auVar95 = vmulps_avx512vl(local_1a0,auVar95);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_360);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_380);
          auVar95 = vfmadd231ps_avx512vl(auVar95,local_180,auVar94);
          auVar94 = *(undefined1 (*) [32])(lVar78 + 0x21fed98 + lVar77 * 4);
          auVar103 = vfmadd231ps_avx512vl(auVar103,auVar94,local_320);
          auVar90 = vfmadd231ps_avx512vl(auVar90,auVar94,local_340);
          auVar94 = vfmadd231ps_avx512vl(auVar95,local_160,auVar94);
          auVar95 = vfmadd231ps_avx512vl(auVar103,auVar96,local_2e0);
          auVar103 = vfmadd231ps_avx512vl(auVar90,auVar96,local_300);
          auVar94 = vfmadd231ps_avx512vl(auVar94,local_540,auVar96);
          auVar90 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar105,auVar90);
          vandps_avx512vl(auVar104,auVar90);
          auVar96 = vmaxps_avx(auVar90,auVar90);
          vandps_avx512vl(ZEXT1632(auVar6),auVar90);
          auVar96 = vmaxps_avx(auVar96,auVar90);
          auVar66._4_4_ = uStack_49c;
          auVar66._0_4_ = local_4a0;
          auVar66._8_4_ = uStack_498;
          auVar66._12_4_ = uStack_494;
          auVar66._16_4_ = uStack_490;
          auVar66._20_4_ = uStack_48c;
          auVar66._24_4_ = uStack_488;
          auVar66._28_4_ = uStack_484;
          uVar70 = vcmpps_avx512vl(auVar96,auVar66,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar119._0_4_ = (float)((uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar105._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar119._4_4_ = (float)((uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar105._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar119._8_4_ = (float)((uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar105._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar119._12_4_ = (float)((uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar105._12_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar119._16_4_ = (float)((uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar105._16_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar119._20_4_ = (float)((uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar105._20_4_)
          ;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar119._24_4_ = (float)((uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar105._24_4_)
          ;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar119._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar105._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar120._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar104._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar104._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar104._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar120._12_4_ =
               (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar104._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar120._16_4_ =
               (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar104._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar120._20_4_ =
               (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar104._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar120._24_4_ =
               (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar104._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar120._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar104._28_4_;
          vandps_avx512vl(auVar95,auVar90);
          vandps_avx512vl(auVar103,auVar90);
          auVar96 = vmaxps_avx(auVar120,auVar120);
          vandps_avx512vl(auVar94,auVar90);
          auVar96 = vmaxps_avx(auVar96,auVar120);
          uVar70 = vcmpps_avx512vl(auVar96,auVar66,1);
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar121._0_4_ = (uint)bVar15 * auVar99._0_4_ | (uint)!bVar15 * auVar95._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar15 * auVar99._4_4_ | (uint)!bVar15 * auVar95._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar15 * auVar99._8_4_ | (uint)!bVar15 * auVar95._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar15 * auVar99._12_4_ | (uint)!bVar15 * auVar95._12_4_;
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar15 * auVar99._16_4_ | (uint)!bVar15 * auVar95._16_4_;
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar15 * auVar99._20_4_ | (uint)!bVar15 * auVar95._20_4_;
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar15 * auVar99._24_4_ | (uint)!bVar15 * auVar95._24_4_;
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar121._28_4_ = (uint)bVar15 * auVar99._28_4_ | (uint)!bVar15 * auVar95._28_4_;
          bVar15 = (bool)((byte)uVar70 & 1);
          auVar122._0_4_ = (float)((uint)bVar15 * auVar100._0_4_ | (uint)!bVar15 * auVar103._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar122._4_4_ = (float)((uint)bVar15 * auVar100._4_4_ | (uint)!bVar15 * auVar103._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar122._8_4_ = (float)((uint)bVar15 * auVar100._8_4_ | (uint)!bVar15 * auVar103._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar122._12_4_ =
               (float)((uint)bVar15 * auVar100._12_4_ | (uint)!bVar15 * auVar103._12_4_);
          bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
          auVar122._16_4_ =
               (float)((uint)bVar15 * auVar100._16_4_ | (uint)!bVar15 * auVar103._16_4_);
          bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
          auVar122._20_4_ =
               (float)((uint)bVar15 * auVar100._20_4_ | (uint)!bVar15 * auVar103._20_4_);
          bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
          auVar122._24_4_ =
               (float)((uint)bVar15 * auVar100._24_4_ | (uint)!bVar15 * auVar103._24_4_);
          bVar15 = SUB81(uVar70 >> 7,0);
          auVar122._28_4_ = (uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar103._28_4_;
          auVar196._8_4_ = 0x80000000;
          auVar196._0_8_ = 0x8000000080000000;
          auVar196._12_4_ = 0x80000000;
          auVar196._16_4_ = 0x80000000;
          auVar196._20_4_ = 0x80000000;
          auVar196._24_4_ = 0x80000000;
          auVar196._28_4_ = 0x80000000;
          auVar96 = vxorps_avx512vl(auVar121,auVar196);
          auVar89 = vxorps_avx512vl(auVar90._0_16_,auVar90._0_16_);
          auVar94 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar89));
          auVar6 = vfmadd231ps_fma(auVar94,auVar120,auVar120);
          auVar94 = vrsqrt14ps_avx512vl(ZEXT1632(auVar6));
          auVar205._8_4_ = 0xbf000000;
          auVar205._0_8_ = 0xbf000000bf000000;
          auVar205._12_4_ = 0xbf000000;
          auVar205._16_4_ = 0xbf000000;
          auVar205._20_4_ = 0xbf000000;
          auVar205._24_4_ = 0xbf000000;
          auVar205._28_4_ = 0xbf000000;
          fVar159 = auVar94._0_4_;
          fVar140 = auVar94._4_4_;
          fVar155 = auVar94._8_4_;
          fVar156 = auVar94._12_4_;
          fVar168 = auVar94._16_4_;
          fVar177 = auVar94._20_4_;
          fVar81 = auVar94._24_4_;
          auVar49._4_4_ = fVar140 * fVar140 * fVar140 * auVar6._4_4_ * -0.5;
          auVar49._0_4_ = fVar159 * fVar159 * fVar159 * auVar6._0_4_ * -0.5;
          auVar49._8_4_ = fVar155 * fVar155 * fVar155 * auVar6._8_4_ * -0.5;
          auVar49._12_4_ = fVar156 * fVar156 * fVar156 * auVar6._12_4_ * -0.5;
          auVar49._16_4_ = fVar168 * fVar168 * fVar168 * -0.0;
          auVar49._20_4_ = fVar177 * fVar177 * fVar177 * -0.0;
          auVar49._24_4_ = fVar81 * fVar81 * fVar81 * -0.0;
          auVar49._28_4_ = auVar120._28_4_;
          auVar95 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar94 = vfmadd231ps_avx512vl(auVar49,auVar95,auVar94);
          auVar50._4_4_ = auVar120._4_4_ * auVar94._4_4_;
          auVar50._0_4_ = auVar120._0_4_ * auVar94._0_4_;
          auVar50._8_4_ = auVar120._8_4_ * auVar94._8_4_;
          auVar50._12_4_ = auVar120._12_4_ * auVar94._12_4_;
          auVar50._16_4_ = auVar120._16_4_ * auVar94._16_4_;
          auVar50._20_4_ = auVar120._20_4_ * auVar94._20_4_;
          auVar50._24_4_ = auVar120._24_4_ * auVar94._24_4_;
          auVar50._28_4_ = 0;
          auVar51._4_4_ = auVar94._4_4_ * -auVar119._4_4_;
          auVar51._0_4_ = auVar94._0_4_ * -auVar119._0_4_;
          auVar51._8_4_ = auVar94._8_4_ * -auVar119._8_4_;
          auVar51._12_4_ = auVar94._12_4_ * -auVar119._12_4_;
          auVar51._16_4_ = auVar94._16_4_ * -auVar119._16_4_;
          auVar51._20_4_ = auVar94._20_4_ * -auVar119._20_4_;
          auVar51._24_4_ = auVar94._24_4_ * -auVar119._24_4_;
          auVar51._28_4_ = auVar120._28_4_;
          auVar105 = vmulps_avx512vl(auVar94,ZEXT1632(auVar89));
          auVar103 = ZEXT1632(auVar89);
          auVar94 = vfmadd213ps_avx512vl(auVar121,auVar121,auVar103);
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar122,auVar122);
          auVar104 = vrsqrt14ps_avx512vl(auVar94);
          auVar94 = vmulps_avx512vl(auVar94,auVar205);
          fVar159 = auVar104._0_4_;
          fVar140 = auVar104._4_4_;
          fVar155 = auVar104._8_4_;
          fVar156 = auVar104._12_4_;
          fVar168 = auVar104._16_4_;
          fVar177 = auVar104._20_4_;
          fVar81 = auVar104._24_4_;
          auVar52._4_4_ = fVar140 * fVar140 * fVar140 * auVar94._4_4_;
          auVar52._0_4_ = fVar159 * fVar159 * fVar159 * auVar94._0_4_;
          auVar52._8_4_ = fVar155 * fVar155 * fVar155 * auVar94._8_4_;
          auVar52._12_4_ = fVar156 * fVar156 * fVar156 * auVar94._12_4_;
          auVar52._16_4_ = fVar168 * fVar168 * fVar168 * auVar94._16_4_;
          auVar52._20_4_ = fVar177 * fVar177 * fVar177 * auVar94._20_4_;
          auVar52._24_4_ = fVar81 * fVar81 * fVar81 * auVar94._24_4_;
          auVar52._28_4_ = auVar94._28_4_;
          auVar94 = vfmadd231ps_avx512vl(auVar52,auVar95,auVar104);
          auVar53._4_4_ = auVar122._4_4_ * auVar94._4_4_;
          auVar53._0_4_ = auVar122._0_4_ * auVar94._0_4_;
          auVar53._8_4_ = auVar122._8_4_ * auVar94._8_4_;
          auVar53._12_4_ = auVar122._12_4_ * auVar94._12_4_;
          auVar53._16_4_ = auVar122._16_4_ * auVar94._16_4_;
          auVar53._20_4_ = auVar122._20_4_ * auVar94._20_4_;
          auVar53._24_4_ = auVar122._24_4_ * auVar94._24_4_;
          auVar53._28_4_ = auVar104._28_4_;
          auVar54._4_4_ = auVar94._4_4_ * auVar96._4_4_;
          auVar54._0_4_ = auVar94._0_4_ * auVar96._0_4_;
          auVar54._8_4_ = auVar94._8_4_ * auVar96._8_4_;
          auVar54._12_4_ = auVar94._12_4_ * auVar96._12_4_;
          auVar54._16_4_ = auVar94._16_4_ * auVar96._16_4_;
          auVar54._20_4_ = auVar94._20_4_ * auVar96._20_4_;
          auVar54._24_4_ = auVar94._24_4_ * auVar96._24_4_;
          auVar54._28_4_ = auVar96._28_4_;
          auVar96 = vmulps_avx512vl(auVar94,auVar103);
          auVar6 = vfmadd213ps_fma(auVar50,auVar92,ZEXT1632(auVar83));
          auVar7 = vfmadd213ps_fma(auVar51,auVar92,ZEXT1632(auVar86));
          auVar95 = vfmadd213ps_avx512vl(auVar105,auVar92,auVar97);
          auVar104 = vfmadd213ps_avx512vl(auVar53,auVar93,ZEXT1632(auVar85));
          auVar9 = vfnmadd213ps_fma(auVar50,auVar92,ZEXT1632(auVar83));
          auVar83 = vfmadd213ps_fma(auVar54,auVar93,ZEXT1632(auVar84));
          auVar10 = vfnmadd213ps_fma(auVar51,auVar92,ZEXT1632(auVar86));
          auVar86 = vfmadd213ps_fma(auVar96,auVar93,auVar98);
          auVar169 = vfnmadd231ps_fma(auVar97,auVar92,auVar105);
          auVar87 = vfnmadd213ps_fma(auVar53,auVar93,ZEXT1632(auVar85));
          auVar160 = vfnmadd213ps_fma(auVar54,auVar93,ZEXT1632(auVar84));
          auVar88 = vfnmadd231ps_fma(auVar98,auVar93,auVar96);
          auVar98 = vsubps_avx512vl(auVar104,ZEXT1632(auVar9));
          auVar96 = vsubps_avx(ZEXT1632(auVar83),ZEXT1632(auVar10));
          auVar94 = vsubps_avx(ZEXT1632(auVar86),ZEXT1632(auVar169));
          auVar55._4_4_ = auVar96._4_4_ * auVar169._4_4_;
          auVar55._0_4_ = auVar96._0_4_ * auVar169._0_4_;
          auVar55._8_4_ = auVar96._8_4_ * auVar169._8_4_;
          auVar55._12_4_ = auVar96._12_4_ * auVar169._12_4_;
          auVar55._16_4_ = auVar96._16_4_ * 0.0;
          auVar55._20_4_ = auVar96._20_4_ * 0.0;
          auVar55._24_4_ = auVar96._24_4_ * 0.0;
          auVar55._28_4_ = auVar105._28_4_;
          auVar85 = vfmsub231ps_fma(auVar55,ZEXT1632(auVar10),auVar94);
          auVar56._4_4_ = auVar94._4_4_ * auVar9._4_4_;
          auVar56._0_4_ = auVar94._0_4_ * auVar9._0_4_;
          auVar56._8_4_ = auVar94._8_4_ * auVar9._8_4_;
          auVar56._12_4_ = auVar94._12_4_ * auVar9._12_4_;
          auVar56._16_4_ = auVar94._16_4_ * 0.0;
          auVar56._20_4_ = auVar94._20_4_ * 0.0;
          auVar56._24_4_ = auVar94._24_4_ * 0.0;
          auVar56._28_4_ = auVar94._28_4_;
          auVar84 = vfmsub231ps_fma(auVar56,ZEXT1632(auVar169),auVar98);
          auVar57._4_4_ = auVar10._4_4_ * auVar98._4_4_;
          auVar57._0_4_ = auVar10._0_4_ * auVar98._0_4_;
          auVar57._8_4_ = auVar10._8_4_ * auVar98._8_4_;
          auVar57._12_4_ = auVar10._12_4_ * auVar98._12_4_;
          auVar57._16_4_ = auVar98._16_4_ * 0.0;
          auVar57._20_4_ = auVar98._20_4_ * 0.0;
          auVar57._24_4_ = auVar98._24_4_ * 0.0;
          auVar57._28_4_ = auVar98._28_4_;
          auVar8 = vfmsub231ps_fma(auVar57,ZEXT1632(auVar9),auVar96);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar8),auVar103,ZEXT1632(auVar84));
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar103,ZEXT1632(auVar85));
          auVar91 = ZEXT1632(auVar89);
          uVar70 = vcmpps_avx512vl(auVar96,auVar91,2);
          bVar68 = (byte)uVar70;
          fVar132 = (float)((uint)(bVar68 & 1) * auVar6._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar87._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar134 = (float)((uint)bVar15 * auVar6._4_4_ | (uint)!bVar15 * auVar87._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar137 = (float)((uint)bVar15 * auVar6._8_4_ | (uint)!bVar15 * auVar87._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar138 = (float)((uint)bVar15 * auVar6._12_4_ | (uint)!bVar15 * auVar87._12_4_);
          auVar103 = ZEXT1632(CONCAT412(fVar138,CONCAT48(fVar137,CONCAT44(fVar134,fVar132))));
          fVar133 = (float)((uint)(bVar68 & 1) * auVar7._0_4_ |
                           (uint)!(bool)(bVar68 & 1) * auVar160._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          fVar136 = (float)((uint)bVar15 * auVar7._4_4_ | (uint)!bVar15 * auVar160._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          fVar135 = (float)((uint)bVar15 * auVar7._8_4_ | (uint)!bVar15 * auVar160._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          fVar139 = (float)((uint)bVar15 * auVar7._12_4_ | (uint)!bVar15 * auVar160._12_4_);
          auVar99 = ZEXT1632(CONCAT412(fVar139,CONCAT48(fVar135,CONCAT44(fVar136,fVar133))));
          auVar123._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar95._0_4_ |
                      (uint)!(bool)(bVar68 & 1) * auVar88._0_4_);
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar123._4_4_ = (float)((uint)bVar15 * auVar95._4_4_ | (uint)!bVar15 * auVar88._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar123._8_4_ = (float)((uint)bVar15 * auVar95._8_4_ | (uint)!bVar15 * auVar88._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar123._12_4_ = (float)((uint)bVar15 * auVar95._12_4_ | (uint)!bVar15 * auVar88._12_4_);
          fVar155 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar95._16_4_);
          auVar123._16_4_ = fVar155;
          fVar140 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar95._20_4_);
          auVar123._20_4_ = fVar140;
          fVar159 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar95._24_4_);
          auVar123._24_4_ = fVar159;
          iVar1 = (uint)(byte)(uVar70 >> 7) * auVar95._28_4_;
          auVar123._28_4_ = iVar1;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar9),auVar104);
          auVar124._0_4_ =
               (uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar85._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar124._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar85._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar124._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar85._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar124._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar85._12_4_;
          auVar124._16_4_ = (uint)((byte)(uVar70 >> 4) & 1) * auVar96._16_4_;
          auVar124._20_4_ = (uint)((byte)(uVar70 >> 5) & 1) * auVar96._20_4_;
          auVar124._24_4_ = (uint)((byte)(uVar70 >> 6) & 1) * auVar96._24_4_;
          auVar124._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar10),ZEXT1632(auVar83));
          auVar125._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar6._0_4_
                      );
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar125._4_4_ = (float)((uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar6._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar125._8_4_ = (float)((uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar6._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar125._12_4_ = (float)((uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar6._12_4_);
          fVar168 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar96._16_4_);
          auVar125._16_4_ = fVar168;
          fVar156 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar96._20_4_);
          auVar125._20_4_ = fVar156;
          fVar177 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar96._24_4_);
          auVar125._24_4_ = fVar177;
          auVar125._28_4_ = (uint)(byte)(uVar70 >> 7) * auVar96._28_4_;
          auVar96 = vblendmps_avx512vl(ZEXT1632(auVar169),ZEXT1632(auVar86));
          auVar126._0_4_ =
               (float)((uint)(bVar68 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar7._0_4_
                      );
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar126._4_4_ = (float)((uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * auVar7._4_4_);
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar126._8_4_ = (float)((uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * auVar7._8_4_);
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar126._12_4_ = (float)((uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * auVar7._12_4_);
          fVar82 = (float)((uint)((byte)(uVar70 >> 4) & 1) * auVar96._16_4_);
          auVar126._16_4_ = fVar82;
          fVar81 = (float)((uint)((byte)(uVar70 >> 5) & 1) * auVar96._20_4_);
          auVar126._20_4_ = fVar81;
          fVar167 = (float)((uint)((byte)(uVar70 >> 6) & 1) * auVar96._24_4_);
          auVar126._24_4_ = fVar167;
          iVar2 = (uint)(byte)(uVar70 >> 7) * auVar96._28_4_;
          auVar126._28_4_ = iVar2;
          auVar127._0_4_ =
               (uint)(bVar68 & 1) * (int)auVar9._0_4_ | (uint)!(bool)(bVar68 & 1) * auVar104._0_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          auVar127._4_4_ = (uint)bVar15 * (int)auVar9._4_4_ | (uint)!bVar15 * auVar104._4_4_;
          bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
          auVar127._8_4_ = (uint)bVar15 * (int)auVar9._8_4_ | (uint)!bVar15 * auVar104._8_4_;
          bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar127._12_4_ = (uint)bVar15 * (int)auVar9._12_4_ | (uint)!bVar15 * auVar104._12_4_;
          auVar127._16_4_ = (uint)!(bool)((byte)(uVar70 >> 4) & 1) * auVar104._16_4_;
          auVar127._20_4_ = (uint)!(bool)((byte)(uVar70 >> 5) & 1) * auVar104._20_4_;
          auVar127._24_4_ = (uint)!(bool)((byte)(uVar70 >> 6) & 1) * auVar104._24_4_;
          auVar127._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar104._28_4_;
          bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar70 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar70 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar70 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar70 >> 3) & 1);
          auVar104 = vsubps_avx512vl(auVar127,auVar103);
          auVar94 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar19 * (int)auVar10._12_4_ |
                                                  (uint)!bVar19 * auVar83._12_4_,
                                                  CONCAT48((uint)bVar17 * (int)auVar10._8_4_ |
                                                           (uint)!bVar17 * auVar83._8_4_,
                                                           CONCAT44((uint)bVar15 *
                                                                    (int)auVar10._4_4_ |
                                                                    (uint)!bVar15 * auVar83._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar10._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar83._0_4_)))),auVar99);
          auVar187 = ZEXT3264(auVar94);
          auVar95 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar20 * (int)auVar169._12_4_ |
                                                  (uint)!bVar20 * auVar86._12_4_,
                                                  CONCAT48((uint)bVar18 * (int)auVar169._8_4_ |
                                                           (uint)!bVar18 * auVar86._8_4_,
                                                           CONCAT44((uint)bVar16 *
                                                                    (int)auVar169._4_4_ |
                                                                    (uint)!bVar16 * auVar86._4_4_,
                                                                    (uint)(bVar68 & 1) *
                                                                    (int)auVar169._0_4_ |
                                                                    (uint)!(bool)(bVar68 & 1) *
                                                                    auVar86._0_4_)))),auVar123);
          auVar105 = vsubps_avx(auVar103,auVar124);
          auVar191 = ZEXT3264(auVar105);
          auVar98 = vsubps_avx(auVar99,auVar125);
          auVar97 = vsubps_avx(auVar123,auVar126);
          auVar58._4_4_ = auVar95._4_4_ * fVar134;
          auVar58._0_4_ = auVar95._0_4_ * fVar132;
          auVar58._8_4_ = auVar95._8_4_ * fVar137;
          auVar58._12_4_ = auVar95._12_4_ * fVar138;
          auVar58._16_4_ = auVar95._16_4_ * 0.0;
          auVar58._20_4_ = auVar95._20_4_ * 0.0;
          auVar58._24_4_ = auVar95._24_4_ * 0.0;
          auVar58._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar58,auVar123,auVar104);
          auVar175._0_4_ = fVar133 * auVar104._0_4_;
          auVar175._4_4_ = fVar136 * auVar104._4_4_;
          auVar175._8_4_ = fVar135 * auVar104._8_4_;
          auVar175._12_4_ = fVar139 * auVar104._12_4_;
          auVar175._16_4_ = auVar104._16_4_ * 0.0;
          auVar175._20_4_ = auVar104._20_4_ * 0.0;
          auVar175._24_4_ = auVar104._24_4_ * 0.0;
          auVar175._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar175,auVar103,auVar94);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar91,ZEXT1632(auVar83));
          auVar180._0_4_ = auVar94._0_4_ * auVar123._0_4_;
          auVar180._4_4_ = auVar94._4_4_ * auVar123._4_4_;
          auVar180._8_4_ = auVar94._8_4_ * auVar123._8_4_;
          auVar180._12_4_ = auVar94._12_4_ * auVar123._12_4_;
          auVar180._16_4_ = auVar94._16_4_ * fVar155;
          auVar180._20_4_ = auVar94._20_4_ * fVar140;
          auVar180._24_4_ = auVar94._24_4_ * fVar159;
          auVar180._28_4_ = 0;
          auVar83 = vfmsub231ps_fma(auVar180,auVar99,auVar95);
          auVar100 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar83));
          auVar96 = vmulps_avx512vl(auVar97,auVar124);
          auVar96 = vfmsub231ps_avx512vl(auVar96,auVar105,auVar126);
          auVar59._4_4_ = auVar98._4_4_ * auVar126._4_4_;
          auVar59._0_4_ = auVar98._0_4_ * auVar126._0_4_;
          auVar59._8_4_ = auVar98._8_4_ * auVar126._8_4_;
          auVar59._12_4_ = auVar98._12_4_ * auVar126._12_4_;
          auVar59._16_4_ = auVar98._16_4_ * fVar82;
          auVar59._20_4_ = auVar98._20_4_ * fVar81;
          auVar59._24_4_ = auVar98._24_4_ * fVar167;
          auVar59._28_4_ = iVar2;
          auVar83 = vfmsub231ps_fma(auVar59,auVar125,auVar97);
          auVar181._0_4_ = auVar125._0_4_ * auVar105._0_4_;
          auVar181._4_4_ = auVar125._4_4_ * auVar105._4_4_;
          auVar181._8_4_ = auVar125._8_4_ * auVar105._8_4_;
          auVar181._12_4_ = auVar125._12_4_ * auVar105._12_4_;
          auVar181._16_4_ = fVar168 * auVar105._16_4_;
          auVar181._20_4_ = fVar156 * auVar105._20_4_;
          auVar181._24_4_ = fVar177 * auVar105._24_4_;
          auVar181._28_4_ = 0;
          auVar86 = vfmsub231ps_fma(auVar181,auVar98,auVar124);
          auVar96 = vfmadd231ps_avx512vl(ZEXT1632(auVar86),auVar91,auVar96);
          auVar90 = vfmadd231ps_avx512vl(auVar96,auVar91,ZEXT1632(auVar83));
          auVar182 = ZEXT3264(auVar90);
          auVar96 = vmaxps_avx(auVar100,auVar90);
          uVar157 = vcmpps_avx512vl(auVar96,auVar91,2);
          bVar79 = bVar79 & (byte)uVar157;
          if (bVar79 != 0) {
            auVar60._4_4_ = auVar97._4_4_ * auVar94._4_4_;
            auVar60._0_4_ = auVar97._0_4_ * auVar94._0_4_;
            auVar60._8_4_ = auVar97._8_4_ * auVar94._8_4_;
            auVar60._12_4_ = auVar97._12_4_ * auVar94._12_4_;
            auVar60._16_4_ = auVar97._16_4_ * auVar94._16_4_;
            auVar60._20_4_ = auVar97._20_4_ * auVar94._20_4_;
            auVar60._24_4_ = auVar97._24_4_ * auVar94._24_4_;
            auVar60._28_4_ = auVar96._28_4_;
            auVar84 = vfmsub231ps_fma(auVar60,auVar98,auVar95);
            auVar61._4_4_ = auVar95._4_4_ * auVar105._4_4_;
            auVar61._0_4_ = auVar95._0_4_ * auVar105._0_4_;
            auVar61._8_4_ = auVar95._8_4_ * auVar105._8_4_;
            auVar61._12_4_ = auVar95._12_4_ * auVar105._12_4_;
            auVar61._16_4_ = auVar95._16_4_ * auVar105._16_4_;
            auVar61._20_4_ = auVar95._20_4_ * auVar105._20_4_;
            auVar61._24_4_ = auVar95._24_4_ * auVar105._24_4_;
            auVar61._28_4_ = auVar95._28_4_;
            auVar85 = vfmsub231ps_fma(auVar61,auVar104,auVar97);
            auVar62._4_4_ = auVar98._4_4_ * auVar104._4_4_;
            auVar62._0_4_ = auVar98._0_4_ * auVar104._0_4_;
            auVar62._8_4_ = auVar98._8_4_ * auVar104._8_4_;
            auVar62._12_4_ = auVar98._12_4_ * auVar104._12_4_;
            auVar62._16_4_ = auVar98._16_4_ * auVar104._16_4_;
            auVar62._20_4_ = auVar98._20_4_ * auVar104._20_4_;
            auVar62._24_4_ = auVar98._24_4_ * auVar104._24_4_;
            auVar62._28_4_ = auVar98._28_4_;
            auVar6 = vfmsub231ps_fma(auVar62,auVar105,auVar94);
            auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar85),ZEXT1632(auVar6));
            auVar86 = vfmadd231ps_fma(ZEXT1632(auVar83),ZEXT1632(auVar84),
                                      ZEXT1232(ZEXT412(0)) << 0x20);
            auVar96 = vrcp14ps_avx512vl(ZEXT1632(auVar86));
            auVar191 = ZEXT3264(auVar96);
            auVar27._8_4_ = 0x3f800000;
            auVar27._0_8_ = 0x3f8000003f800000;
            auVar27._12_4_ = 0x3f800000;
            auVar27._16_4_ = 0x3f800000;
            auVar27._20_4_ = 0x3f800000;
            auVar27._24_4_ = 0x3f800000;
            auVar27._28_4_ = 0x3f800000;
            auVar94 = vfnmadd213ps_avx512vl(auVar96,ZEXT1632(auVar86),auVar27);
            auVar83 = vfmadd132ps_fma(auVar94,auVar96,auVar96);
            auVar187 = ZEXT1664(auVar83);
            auVar63._4_4_ = auVar6._4_4_ * auVar123._4_4_;
            auVar63._0_4_ = auVar6._0_4_ * auVar123._0_4_;
            auVar63._8_4_ = auVar6._8_4_ * auVar123._8_4_;
            auVar63._12_4_ = auVar6._12_4_ * auVar123._12_4_;
            auVar63._16_4_ = fVar155 * 0.0;
            auVar63._20_4_ = fVar140 * 0.0;
            auVar63._24_4_ = fVar159 * 0.0;
            auVar63._28_4_ = iVar1;
            auVar85 = vfmadd231ps_fma(auVar63,auVar99,ZEXT1632(auVar85));
            auVar85 = vfmadd231ps_fma(ZEXT1632(auVar85),auVar103,ZEXT1632(auVar84));
            fVar159 = auVar83._0_4_;
            fVar140 = auVar83._4_4_;
            fVar155 = auVar83._8_4_;
            fVar156 = auVar83._12_4_;
            local_280 = ZEXT1632(CONCAT412(auVar85._12_4_ * fVar156,
                                           CONCAT48(auVar85._8_4_ * fVar155,
                                                    CONCAT44(auVar85._4_4_ * fVar140,
                                                             auVar85._0_4_ * fVar159))));
            auVar193 = ZEXT3264(local_280);
            auVar67._4_4_ = uStack_47c;
            auVar67._0_4_ = local_480;
            auVar67._8_4_ = uStack_478;
            auVar67._12_4_ = uStack_474;
            auVar67._16_4_ = uStack_470;
            auVar67._20_4_ = uStack_46c;
            auVar67._24_4_ = uStack_468;
            auVar67._28_4_ = uStack_464;
            uVar157 = vcmpps_avx512vl(local_280,auVar67,0xd);
            uVar141 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar28._4_4_ = uVar141;
            auVar28._0_4_ = uVar141;
            auVar28._8_4_ = uVar141;
            auVar28._12_4_ = uVar141;
            auVar28._16_4_ = uVar141;
            auVar28._20_4_ = uVar141;
            auVar28._24_4_ = uVar141;
            auVar28._28_4_ = uVar141;
            uVar21 = vcmpps_avx512vl(local_280,auVar28,2);
            bVar79 = (byte)uVar157 & (byte)uVar21 & bVar79;
            if (bVar79 != 0) {
              uVar80 = vcmpps_avx512vl(ZEXT1632(auVar86),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar80 = bVar79 & uVar80;
              if ((char)uVar80 != '\0') {
                fVar168 = auVar100._0_4_ * fVar159;
                fVar177 = auVar100._4_4_ * fVar140;
                auVar64._4_4_ = fVar177;
                auVar64._0_4_ = fVar168;
                fVar81 = auVar100._8_4_ * fVar155;
                auVar64._8_4_ = fVar81;
                fVar82 = auVar100._12_4_ * fVar156;
                auVar64._12_4_ = fVar82;
                fVar167 = auVar100._16_4_ * 0.0;
                auVar64._16_4_ = fVar167;
                fVar132 = auVar100._20_4_ * 0.0;
                auVar64._20_4_ = fVar132;
                fVar133 = auVar100._24_4_ * 0.0;
                auVar64._24_4_ = fVar133;
                auVar64._28_4_ = auVar100._28_4_;
                auVar166._8_4_ = 0x3f800000;
                auVar166._0_8_ = 0x3f8000003f800000;
                auVar166._12_4_ = 0x3f800000;
                auVar166._16_4_ = 0x3f800000;
                auVar166._20_4_ = 0x3f800000;
                auVar166._24_4_ = 0x3f800000;
                auVar166._28_4_ = 0x3f800000;
                auVar96 = vsubps_avx(auVar166,auVar64);
                local_2c0._0_4_ =
                     (float)((uint)(bVar68 & 1) * (int)fVar168 |
                            (uint)!(bool)(bVar68 & 1) * auVar96._0_4_);
                bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                local_2c0._4_4_ =
                     (float)((uint)bVar15 * (int)fVar177 | (uint)!bVar15 * auVar96._4_4_);
                bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                local_2c0._8_4_ =
                     (float)((uint)bVar15 * (int)fVar81 | (uint)!bVar15 * auVar96._8_4_);
                bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                local_2c0._12_4_ =
                     (float)((uint)bVar15 * (int)fVar82 | (uint)!bVar15 * auVar96._12_4_);
                bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                local_2c0._16_4_ =
                     (float)((uint)bVar15 * (int)fVar167 | (uint)!bVar15 * auVar96._16_4_);
                bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                local_2c0._20_4_ =
                     (float)((uint)bVar15 * (int)fVar132 | (uint)!bVar15 * auVar96._20_4_);
                bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                local_2c0._24_4_ =
                     (float)((uint)bVar15 * (int)fVar133 | (uint)!bVar15 * auVar96._24_4_);
                bVar15 = SUB81(uVar70 >> 7,0);
                local_2c0._28_4_ =
                     (float)((uint)bVar15 * auVar100._28_4_ | (uint)!bVar15 * auVar96._28_4_);
                auVar96 = vsubps_avx(auVar93,auVar92);
                auVar83 = vfmadd213ps_fma(auVar96,local_2c0,auVar92);
                uVar141 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x10);
                auVar29._4_4_ = uVar141;
                auVar29._0_4_ = uVar141;
                auVar29._8_4_ = uVar141;
                auVar29._12_4_ = uVar141;
                auVar29._16_4_ = uVar141;
                auVar29._20_4_ = uVar141;
                auVar29._24_4_ = uVar141;
                auVar29._28_4_ = uVar141;
                auVar96 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                             CONCAT48(auVar83._8_4_ + auVar83._8_4_,
                                                                      CONCAT44(auVar83._4_4_ +
                                                                               auVar83._4_4_,
                                                                               auVar83._0_4_ +
                                                                               auVar83._0_4_)))),
                                          auVar29);
                uVar73 = vcmpps_avx512vl(local_280,auVar96,6);
                uVar80 = uVar80 & uVar73;
                bVar79 = (byte)uVar80;
                if (bVar79 != 0) {
                  auVar158._0_4_ = auVar90._0_4_ * fVar159;
                  auVar158._4_4_ = auVar90._4_4_ * fVar140;
                  auVar158._8_4_ = auVar90._8_4_ * fVar155;
                  auVar158._12_4_ = auVar90._12_4_ * fVar156;
                  auVar158._16_4_ = auVar90._16_4_ * 0.0;
                  auVar158._20_4_ = auVar90._20_4_ * 0.0;
                  auVar158._24_4_ = auVar90._24_4_ * 0.0;
                  auVar158._28_4_ = 0;
                  auVar176._8_4_ = 0x3f800000;
                  auVar176._0_8_ = 0x3f8000003f800000;
                  auVar176._12_4_ = 0x3f800000;
                  auVar176._16_4_ = 0x3f800000;
                  auVar176._20_4_ = 0x3f800000;
                  auVar176._24_4_ = 0x3f800000;
                  auVar176._28_4_ = 0x3f800000;
                  auVar96 = vsubps_avx(auVar176,auVar158);
                  auVar128._0_4_ =
                       (uint)(bVar68 & 1) * (int)auVar158._0_4_ |
                       (uint)!(bool)(bVar68 & 1) * auVar96._0_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 1) & 1);
                  auVar128._4_4_ =
                       (uint)bVar15 * (int)auVar158._4_4_ | (uint)!bVar15 * auVar96._4_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 2) & 1);
                  auVar128._8_4_ =
                       (uint)bVar15 * (int)auVar158._8_4_ | (uint)!bVar15 * auVar96._8_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 3) & 1);
                  auVar128._12_4_ =
                       (uint)bVar15 * (int)auVar158._12_4_ | (uint)!bVar15 * auVar96._12_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 4) & 1);
                  auVar128._16_4_ =
                       (uint)bVar15 * (int)auVar158._16_4_ | (uint)!bVar15 * auVar96._16_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 5) & 1);
                  auVar128._20_4_ =
                       (uint)bVar15 * (int)auVar158._20_4_ | (uint)!bVar15 * auVar96._20_4_;
                  bVar15 = (bool)((byte)(uVar70 >> 6) & 1);
                  auVar128._24_4_ =
                       (uint)bVar15 * (int)auVar158._24_4_ | (uint)!bVar15 * auVar96._24_4_;
                  auVar128._28_4_ = (uint)!SUB81(uVar70 >> 7,0) * auVar96._28_4_;
                  auVar30._8_4_ = 0x40000000;
                  auVar30._0_8_ = 0x4000000040000000;
                  auVar30._12_4_ = 0x40000000;
                  auVar30._16_4_ = 0x40000000;
                  auVar30._20_4_ = 0x40000000;
                  auVar30._24_4_ = 0x40000000;
                  auVar30._28_4_ = 0x40000000;
                  local_2a0 = vfmsub132ps_avx512vl(auVar128,auVar176,auVar30);
                  local_260 = (int)lVar77;
                  local_25c = iVar12;
                  auVar191 = ZEXT1664(local_5d0);
                  local_250 = local_5d0;
                  local_240 = local_5a0._0_8_;
                  uStack_238 = local_5a0._8_8_;
                  local_230 = local_5b0._0_8_;
                  uStack_228 = local_5b0._8_8_;
                  local_220 = local_5c0;
                  uStack_218 = uStack_5b8;
                  pGVar75 = (context->scene->geometries).items[uVar11].ptr;
                  if ((pGVar75->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar83 = vcvtsi2ss_avx512f(auVar89,(int)lVar77);
                    fVar159 = auVar83._0_4_;
                    local_200[0] = (fVar159 + local_2c0._0_4_ + 0.0) * local_120;
                    local_200[1] = (fVar159 + local_2c0._4_4_ + 1.0) * fStack_11c;
                    local_200[2] = (fVar159 + local_2c0._8_4_ + 2.0) * fStack_118;
                    local_200[3] = (fVar159 + local_2c0._12_4_ + 3.0) * fStack_114;
                    fStack_1f0 = (fVar159 + local_2c0._16_4_ + 4.0) * fStack_110;
                    fStack_1ec = (fVar159 + local_2c0._20_4_ + 5.0) * fStack_10c;
                    fStack_1e8 = (fVar159 + local_2c0._24_4_ + 6.0) * fStack_108;
                    fStack_1e4 = fVar159 + local_2c0._28_4_ + 7.0;
                    local_1e0 = local_2a0;
                    local_1c0 = local_280;
                    auVar150._8_4_ = 0x7f800000;
                    auVar150._0_8_ = 0x7f8000007f800000;
                    auVar150._12_4_ = 0x7f800000;
                    auVar150._16_4_ = 0x7f800000;
                    auVar150._20_4_ = 0x7f800000;
                    auVar150._24_4_ = 0x7f800000;
                    auVar150._28_4_ = 0x7f800000;
                    auVar96 = vblendmps_avx512vl(auVar150,local_280);
                    auVar129._0_4_ =
                         (uint)(bVar79 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar79 & 1) * 0x7f800000
                    ;
                    bVar15 = (bool)((byte)(uVar80 >> 1) & 1);
                    auVar129._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar80 >> 2) & 1);
                    auVar129._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar80 >> 3) & 1);
                    auVar129._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar80 >> 4) & 1);
                    auVar129._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar80 >> 5) & 1);
                    auVar129._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = (bool)((byte)(uVar80 >> 6) & 1);
                    auVar129._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * 0x7f800000;
                    bVar15 = SUB81(uVar80 >> 7,0);
                    auVar129._28_4_ = (uint)bVar15 * auVar96._28_4_ | (uint)!bVar15 * 0x7f800000;
                    auVar96 = vshufps_avx(auVar129,auVar129,0xb1);
                    auVar96 = vminps_avx(auVar129,auVar96);
                    auVar94 = vshufpd_avx(auVar96,auVar96,5);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    auVar94 = vpermpd_avx2(auVar96,0x4e);
                    auVar96 = vminps_avx(auVar96,auVar94);
                    uVar157 = vcmpps_avx512vl(auVar129,auVar96,0);
                    uVar71 = (uint)uVar80;
                    if ((bVar79 & (byte)uVar157) != 0) {
                      uVar71 = (uint)(bVar79 & (byte)uVar157);
                    }
                    uVar72 = 0;
                    for (; (uVar71 & 1) == 0; uVar71 = uVar71 >> 1 | 0x80000000) {
                      uVar72 = uVar72 + 1;
                    }
                    uVar70 = (ulong)uVar72;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_140 = vmovdqa64_avx512vl(auVar206._0_32_);
                      local_560 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                      local_520._0_8_ = pGVar75;
                      local_548 = lVar74;
                      local_500 = local_280;
                      do {
                        local_420 = local_200[uVar70];
                        local_410 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                        *(undefined4 *)(ray + k * 4 + 0x80) =
                             *(undefined4 *)(local_1c0 + uVar70 * 4);
                        local_590.context = context->user;
                        fVar140 = 1.0 - local_420;
                        fVar159 = fVar140 * fVar140 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar140 * fVar140)),
                                                  ZEXT416((uint)(local_420 * fVar140)),
                                                  ZEXT416(0xc0000000));
                        auVar86 = vfmsub132ss_fma(ZEXT416((uint)(local_420 * fVar140)),
                                                  ZEXT416((uint)(local_420 * local_420)),
                                                  ZEXT416(0x40000000));
                        fVar140 = auVar83._0_4_ * 3.0;
                        fVar155 = auVar86._0_4_ * 3.0;
                        fVar156 = local_420 * local_420 * 3.0;
                        auVar185._0_4_ = fVar156 * (float)local_5c0._0_4_;
                        auVar185._4_4_ = fVar156 * (float)local_5c0._4_4_;
                        auVar185._8_4_ = fVar156 * (float)uStack_5b8;
                        auVar185._12_4_ = fVar156 * uStack_5b8._4_4_;
                        auVar187 = ZEXT1664(auVar185);
                        auVar142._4_4_ = fVar155;
                        auVar142._0_4_ = fVar155;
                        auVar142._8_4_ = fVar155;
                        auVar142._12_4_ = fVar155;
                        auVar83 = vfmadd132ps_fma(auVar142,auVar185,local_5b0);
                        auVar172._4_4_ = fVar140;
                        auVar172._0_4_ = fVar140;
                        auVar172._8_4_ = fVar140;
                        auVar172._12_4_ = fVar140;
                        auVar83 = vfmadd132ps_fma(auVar172,auVar83,local_5a0);
                        auVar143._4_4_ = fVar159;
                        auVar143._0_4_ = fVar159;
                        auVar143._8_4_ = fVar159;
                        auVar143._12_4_ = fVar159;
                        auVar83 = vfmadd213ps_fma(auVar143,auVar191._0_16_,auVar83);
                        local_450 = auVar83._0_4_;
                        local_440 = vshufps_avx(auVar83,auVar83,0x55);
                        auVar182 = ZEXT1664(local_440);
                        local_430 = vshufps_avx(auVar83,auVar83,0xaa);
                        iStack_44c = local_450;
                        iStack_448 = local_450;
                        iStack_444 = local_450;
                        fStack_41c = local_420;
                        fStack_418 = local_420;
                        fStack_414 = local_420;
                        uStack_40c = local_410;
                        uStack_408 = local_410;
                        uStack_404 = local_410;
                        local_400 = local_4c0._0_8_;
                        uStack_3f8 = local_4c0._8_8_;
                        local_3f0 = local_4b0;
                        vpcmpeqd_avx2(ZEXT1632(local_4b0),ZEXT1632(local_4b0));
                        uStack_3dc = (local_590.context)->instID[0];
                        local_3e0 = uStack_3dc;
                        uStack_3d8 = uStack_3dc;
                        uStack_3d4 = uStack_3dc;
                        uStack_3d0 = (local_590.context)->instPrimID[0];
                        uStack_3cc = uStack_3d0;
                        uStack_3c8 = uStack_3d0;
                        uStack_3c4 = uStack_3d0;
                        local_5e0 = local_4d0;
                        local_590.valid = (int *)local_5e0;
                        local_590.geometryUserPtr = pGVar75->userPtr;
                        local_590.hit = (RTCHitN *)&local_450;
                        local_590.N = 4;
                        local_590.ray = (RTCRayN *)ray;
                        if (pGVar75->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar182 = ZEXT1664(local_440);
                          auVar187 = ZEXT1664(auVar185);
                          (*pGVar75->intersectionFilterN)(&local_590);
                          auVar193 = ZEXT3264(local_500);
                          auVar191 = ZEXT1664(local_5d0);
                          pGVar75 = (Geometry *)local_520._0_8_;
                        }
                        uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                        if ((uVar73 & 0xf) == 0) {
LAB_019b4366:
                          *(undefined4 *)(ray + k * 4 + 0x80) = local_560._0_4_;
                        }
                        else {
                          p_Var14 = context->args->filter;
                          if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar75->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar182 = ZEXT1664(auVar182._0_16_);
                            auVar187 = ZEXT1664(auVar187._0_16_);
                            (*p_Var14)(&local_590);
                            auVar193 = ZEXT3264(local_500);
                            auVar191 = ZEXT1664(local_5d0);
                            pGVar75 = (Geometry *)local_520._0_8_;
                          }
                          uVar73 = vptestmd_avx512vl(local_5e0,local_5e0);
                          uVar73 = uVar73 & 0xf;
                          bVar79 = (byte)uVar73;
                          if (bVar79 == 0) goto LAB_019b4366;
                          iVar1 = *(int *)(local_590.hit + 4);
                          iVar2 = *(int *)(local_590.hit + 8);
                          iVar65 = *(int *)(local_590.hit + 0xc);
                          bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar17 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xc0) =
                               (uint)(bVar79 & 1) * *(int *)local_590.hit |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xc0);
                          *(uint *)(local_590.ray + 0xc4) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xc4)
                          ;
                          *(uint *)(local_590.ray + 200) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 200);
                          *(uint *)(local_590.ray + 0xcc) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0xcc);
                          iVar1 = *(int *)(local_590.hit + 0x14);
                          iVar2 = *(int *)(local_590.hit + 0x18);
                          iVar65 = *(int *)(local_590.hit + 0x1c);
                          bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar17 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xd0) =
                               (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x10) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xd0);
                          *(uint *)(local_590.ray + 0xd4) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xd4)
                          ;
                          *(uint *)(local_590.ray + 0xd8) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xd8)
                          ;
                          *(uint *)(local_590.ray + 0xdc) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0xdc);
                          iVar1 = *(int *)(local_590.hit + 0x24);
                          iVar2 = *(int *)(local_590.hit + 0x28);
                          iVar65 = *(int *)(local_590.hit + 0x2c);
                          bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar17 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xe0) =
                               (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x20) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xe0);
                          *(uint *)(local_590.ray + 0xe4) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xe4)
                          ;
                          *(uint *)(local_590.ray + 0xe8) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xe8)
                          ;
                          *(uint *)(local_590.ray + 0xec) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0xec);
                          iVar1 = *(int *)(local_590.hit + 0x34);
                          iVar2 = *(int *)(local_590.hit + 0x38);
                          iVar65 = *(int *)(local_590.hit + 0x3c);
                          bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar17 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0xf0) =
                               (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x30) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0xf0);
                          *(uint *)(local_590.ray + 0xf4) =
                               (uint)bVar15 * iVar1 | (uint)!bVar15 * *(int *)(local_590.ray + 0xf4)
                          ;
                          *(uint *)(local_590.ray + 0xf8) =
                               (uint)bVar16 * iVar2 | (uint)!bVar16 * *(int *)(local_590.ray + 0xf8)
                          ;
                          *(uint *)(local_590.ray + 0xfc) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0xfc);
                          iVar1 = *(int *)(local_590.hit + 0x44);
                          iVar2 = *(int *)(local_590.hit + 0x48);
                          iVar65 = *(int *)(local_590.hit + 0x4c);
                          bVar15 = (bool)((byte)(uVar73 >> 1) & 1);
                          bVar16 = (bool)((byte)(uVar73 >> 2) & 1);
                          bVar17 = SUB81(uVar73 >> 3,0);
                          *(uint *)(local_590.ray + 0x100) =
                               (uint)(bVar79 & 1) * *(int *)(local_590.hit + 0x40) |
                               (uint)!(bool)(bVar79 & 1) * *(int *)(local_590.ray + 0x100);
                          *(uint *)(local_590.ray + 0x104) =
                               (uint)bVar15 * iVar1 |
                               (uint)!bVar15 * *(int *)(local_590.ray + 0x104);
                          *(uint *)(local_590.ray + 0x108) =
                               (uint)bVar16 * iVar2 |
                               (uint)!bVar16 * *(int *)(local_590.ray + 0x108);
                          *(uint *)(local_590.ray + 0x10c) =
                               (uint)bVar17 * iVar65 |
                               (uint)!bVar17 * *(int *)(local_590.ray + 0x10c);
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x50))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x110) = auVar83;
                          auVar83 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x60))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x120) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x70))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x130) = auVar83;
                          auVar83 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_590.hit + 0x80))
                          ;
                          *(undefined1 (*) [16])(local_590.ray + 0x140) = auVar83;
                          local_560._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                          local_560._4_4_ = 0;
                          local_560._8_4_ = 0;
                          local_560._12_4_ = 0;
                        }
                        bVar79 = ~(byte)(1 << ((uint)uVar70 & 0x1f)) & (byte)uVar80;
                        auVar151._4_4_ = local_560._0_4_;
                        auVar151._0_4_ = local_560._0_4_;
                        auVar151._8_4_ = local_560._0_4_;
                        auVar151._12_4_ = local_560._0_4_;
                        auVar151._16_4_ = local_560._0_4_;
                        auVar151._20_4_ = local_560._0_4_;
                        auVar151._24_4_ = local_560._0_4_;
                        auVar151._28_4_ = local_560._0_4_;
                        uVar157 = vcmpps_avx512vl(auVar193._0_32_,auVar151,2);
                        if ((bVar79 & (byte)uVar157) == 0) goto LAB_019b4403;
                        bVar79 = bVar79 & (byte)uVar157;
                        uVar80 = (ulong)bVar79;
                        auVar152._8_4_ = 0x7f800000;
                        auVar152._0_8_ = 0x7f8000007f800000;
                        auVar152._12_4_ = 0x7f800000;
                        auVar152._16_4_ = 0x7f800000;
                        auVar152._20_4_ = 0x7f800000;
                        auVar152._24_4_ = 0x7f800000;
                        auVar152._28_4_ = 0x7f800000;
                        auVar96 = vblendmps_avx512vl(auVar152,auVar193._0_32_);
                        auVar130._0_4_ =
                             (uint)(bVar79 & 1) * auVar96._0_4_ |
                             (uint)!(bool)(bVar79 & 1) * 0x7f800000;
                        bVar15 = (bool)(bVar79 >> 1 & 1);
                        auVar130._4_4_ = (uint)bVar15 * auVar96._4_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar79 >> 2 & 1);
                        auVar130._8_4_ = (uint)bVar15 * auVar96._8_4_ | (uint)!bVar15 * 0x7f800000;
                        bVar15 = (bool)(bVar79 >> 3 & 1);
                        auVar130._12_4_ = (uint)bVar15 * auVar96._12_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar79 >> 4 & 1);
                        auVar130._16_4_ = (uint)bVar15 * auVar96._16_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar79 >> 5 & 1);
                        auVar130._20_4_ = (uint)bVar15 * auVar96._20_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        bVar15 = (bool)(bVar79 >> 6 & 1);
                        auVar130._24_4_ = (uint)bVar15 * auVar96._24_4_ | (uint)!bVar15 * 0x7f800000
                        ;
                        auVar130._28_4_ =
                             (uint)(bVar79 >> 7) * auVar96._28_4_ |
                             (uint)!(bool)(bVar79 >> 7) * 0x7f800000;
                        auVar96 = vshufps_avx(auVar130,auVar130,0xb1);
                        auVar96 = vminps_avx(auVar130,auVar96);
                        auVar94 = vshufpd_avx(auVar96,auVar96,5);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        auVar94 = vpermpd_avx2(auVar96,0x4e);
                        auVar96 = vminps_avx(auVar96,auVar94);
                        uVar157 = vcmpps_avx512vl(auVar130,auVar96,0);
                        bVar68 = (byte)uVar157 & bVar79;
                        if (bVar68 != 0) {
                          bVar79 = bVar68;
                        }
                        uVar71 = 0;
                        for (uVar72 = (uint)bVar79; (uVar72 & 1) == 0;
                            uVar72 = uVar72 >> 1 | 0x80000000) {
                          uVar71 = uVar71 + 1;
                        }
                        uVar70 = (ulong)uVar71;
                      } while( true );
                    }
                    fVar159 = local_200[uVar70];
                    uVar141 = *(undefined4 *)(local_1e0 + uVar70 * 4);
                    fVar155 = 1.0 - fVar159;
                    fVar140 = fVar155 * fVar155 * -3.0;
                    auVar182 = ZEXT464((uint)fVar140);
                    auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar155 * fVar155)),
                                              ZEXT416((uint)(fVar159 * fVar155)),ZEXT416(0xc0000000)
                                             );
                    auVar86 = vfmsub132ss_fma(ZEXT416((uint)(fVar159 * fVar155)),
                                              ZEXT416((uint)(fVar159 * fVar159)),ZEXT416(0x40000000)
                                             );
                    fVar155 = auVar83._0_4_ * 3.0;
                    fVar156 = auVar86._0_4_ * 3.0;
                    fVar168 = fVar159 * fVar159 * 3.0;
                    auVar184._0_4_ = fVar168 * (float)local_5c0._0_4_;
                    auVar184._4_4_ = fVar168 * (float)local_5c0._4_4_;
                    auVar184._8_4_ = fVar168 * (float)uStack_5b8;
                    auVar184._12_4_ = fVar168 * uStack_5b8._4_4_;
                    auVar187 = ZEXT1664(auVar184);
                    auVar163._4_4_ = fVar156;
                    auVar163._0_4_ = fVar156;
                    auVar163._8_4_ = fVar156;
                    auVar163._12_4_ = fVar156;
                    auVar83 = vfmadd132ps_fma(auVar163,auVar184,local_5b0);
                    auVar171._4_4_ = fVar155;
                    auVar171._0_4_ = fVar155;
                    auVar171._8_4_ = fVar155;
                    auVar171._12_4_ = fVar155;
                    auVar83 = vfmadd132ps_fma(auVar171,auVar83,local_5a0);
                    auVar164._4_4_ = fVar140;
                    auVar164._0_4_ = fVar140;
                    auVar164._8_4_ = fVar140;
                    auVar164._12_4_ = fVar140;
                    auVar83 = vfmadd213ps_fma(auVar164,local_5d0,auVar83);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1c0 + uVar70 * 4);
                    *(int *)(ray + k * 4 + 0xc0) = auVar83._0_4_;
                    uVar13 = vextractps_avx(auVar83,1);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar13;
                    uVar13 = vextractps_avx(auVar83,2);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = uVar13;
                    *(float *)(ray + k * 4 + 0xf0) = fVar159;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar141;
                    *(undefined4 *)(ray + k * 4 + 0x110) = uVar3;
                    *(uint *)(ray + k * 4 + 0x120) = uVar11;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_019b4069;
      }
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar26._4_4_ = uVar3;
    auVar26._0_4_ = uVar3;
    auVar26._8_4_ = uVar3;
    auVar26._12_4_ = uVar3;
    auVar26._16_4_ = uVar3;
    auVar26._20_4_ = uVar3;
    auVar26._24_4_ = uVar3;
    auVar26._28_4_ = uVar3;
    uVar157 = vcmpps_avx512vl(local_80,auVar26,2);
    uVar76 = (ulong)((uint)uVar76 & (uint)uVar157);
  } while( true );
LAB_019b4403:
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar207 = ZEXT3264(auVar96);
  auVar83 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar208 = ZEXT1664(auVar83);
  auVar209 = ZEXT464(0x35000000);
  auVar96 = vmovdqa64_avx512vl(local_140);
  auVar206 = ZEXT3264(auVar96);
  lVar74 = local_548;
LAB_019b4069:
  lVar77 = lVar77 + 8;
  goto LAB_019b3772;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }